

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813.cpp
# Opt level: O2

void __thiscall
chrono::fea::Brick_ForceNumerical::Evaluate
          (Brick_ForceNumerical *this,ChVectorN<double,_330> *result,double x,double y,double z)

{
  ShapeVector *a;
  ShapeVector *a_00;
  ShapeVector *a_01;
  ChMatrixNM<double,_6,_9> *dst;
  ChMatrixNM<double,_6,_6> *this_00;
  ChMatrixNM<double,_6,_24> *this_01;
  Scalar SVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  double *pdVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined8 uVar34;
  MatrixBase<Eigen::Matrix<double,6,1,0,6,1>> *pMVar35;
  ChVectorN<double,_330> *vector;
  Scalar *pSVar36;
  Scalar *pSVar37;
  ChMatrixNM<double,_3,_24> *pCVar38;
  Scalar *pSVar39;
  Scalar *pSVar40;
  Scalar *pSVar41;
  long lVar42;
  ChElementHexaANCF_3813 *pCVar43;
  int i;
  long lVar44;
  int i_2;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  Scalar SVar56;
  ResScalar RVar57;
  double dVar58;
  double dVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  double extraout_XMM0_Qb;
  double extraout_XMM0_Qb_00;
  undefined1 auVar90 [64];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  double dVar141;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  double dVar162;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  double dVar172;
  double dVar173;
  undefined1 auVar174 [16];
  double dVar175;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  double I1;
  double I2;
  ChMatrix33<double> CGN;
  ChVectorN<double,_6> TEMP5;
  ChVectorN<double,_6> strain_1;
  ChVectorN<double,_9> HE1;
  ChMatrix33<double> STRN;
  ChMatrix33<double> I1PC;
  ChMatrix33<double> INVCGN;
  double factor_g;
  ChVectorN<double,_8> d0d0Nz;
  ChVectorN<double,_8> d0d0Ny;
  ChVectorN<double,_8> ddNz;
  ChVectorN<double,_8> ddNy;
  ChMatrix33<double> I1PCN;
  double factor_k;
  ChVector<double> A2;
  ChVector<double> A3;
  ChMatrixNM<double,_9,_6> temp56;
  ChVectorN<double,_8> d0d0Nx;
  ChVectorN<double,_8> ddNx;
  ChMatrix33<double> JPCN;
  ChMatrix33<double> I2PCN;
  ChMatrix33<double> STR;
  ChMatrixNM<double,_9,_24> GDEPSP;
  ChVectorN<double,_216> GDEPSPVec;
  ChMatrixNM<double,_3,_3> j0;
  ChMatrixNM<double,_3,_3> rd0;
  ChVectorN<double,_81> KALPHAVec;
  ChMatrixNM<double,_6,_24> strainD_til;
  ChMatrixNM<double,_9,_9> KALPHA;
  ChMatrixNM<double,_8,_8> d0_d0;
  ChMatrixNM<double,_8,_8> d_d;
  double local_25f0;
  double local_25e0;
  double local_2580;
  double dStack_2578;
  double local_2560;
  double local_2558;
  undefined1 local_2550 [16];
  undefined1 local_2540 [16];
  double local_2528;
  undefined1 local_2520 [16];
  undefined1 local_2510 [16];
  undefined1 local_2500 [16];
  undefined1 local_24f0 [16];
  MatrixBase<Eigen::Matrix<double,6,1,0,6,1>> *local_24d8;
  double local_24d0;
  double local_24c8;
  undefined1 local_24c0 [16];
  undefined1 local_24b0 [16];
  undefined1 local_24a0 [16];
  undefined1 local_2488 [56];
  double dStack_2450;
  double local_2448;
  double local_2440;
  double local_2438;
  double local_2430;
  double local_2428;
  double local_2420;
  double local_2418;
  double local_2410;
  double dStack_2408;
  undefined1 local_2400 [16];
  MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *local_23f0;
  ChVectorN<double,_330> *local_23e8;
  Matrix<double,_6,_1,_0,_6,_1> local_23e0;
  Matrix<double,_9,_1,_0,_9,_1> local_23a8;
  ResScalar local_2360;
  double dStack_2358;
  double local_2350;
  double dStack_2348;
  ResScalar local_2340;
  double dStack_2338;
  double local_2330;
  double dStack_2328;
  double local_2320;
  double dStack_2318;
  undefined1 local_2310 [16];
  Matrix<double,_3,_3,_1,_3,_3> local_2300;
  Matrix<double,_3,_3,_1,_3,_3> local_22b8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
  local_2270;
  Matrix<double,_3,_3,_1,_3,_3> local_2250;
  Matrix<double,_3,_3,_1,_3,_3> local_2208;
  undefined1 local_21c0 [64];
  undefined1 local_2180 [64];
  undefined1 local_2140 [64];
  undefined1 local_2100 [120];
  Matrix<double,_3,_3,_1,_3,_3> local_2088;
  double local_2040 [9];
  ChVector<double> local_1ff8;
  ChVector<double> local_1fe0;
  ChVector<double> local_1fc8;
  undefined1 local_1fb0 [432];
  undefined1 local_1e00 [64];
  undefined1 local_1dc0 [104];
  Matrix<double,_3,_3,_1,_3,_3> local_1d58;
  double local_1d10 [9];
  Matrix<double,_3,_3,_1,_3,_3> local_1cc8;
  undefined1 local_1c80 [16];
  scalar_constant_op<double> local_1c70;
  scalar_constant_op<double> local_1c68;
  scalar_constant_op<double> local_1c60;
  scalar_constant_op<double> local_1c58;
  undefined1 local_15c0 [16];
  scalar_constant_op<double> local_15b0;
  variable_if_dynamic<long,__1> local_15a8;
  variable_if_dynamic<long,__1> local_15a0;
  ChMatrixNM<double,_6,_24> *local_1598;
  non_const_type local_1590;
  double local_1588;
  LhsNested local_1578;
  double local_1568;
  double local_1550;
  undefined8 local_ed8;
  double local_ed0;
  undefined8 local_ec8;
  undefined8 local_ec0;
  double local_eb8;
  undefined8 local_eb0;
  undefined8 local_ea8;
  double local_ea0;
  undefined8 local_e98;
  undefined1 local_e90 [72];
  Matrix<double,_81,_1,_0,_81,_1> local_e48;
  Matrix<double,_6,_24,_1,_6,_24> local_bc0;
  undefined1 local_708 [56];
  double dStack_6d0;
  double local_6c8;
  PlainObjectBase<Eigen::Matrix<double,8,8,1,8,8>> local_480 [512];
  PlainObjectBase<Eigen::Matrix<double,8,8,1,8,8>> local_280 [592];
  undefined1 extraout_var [56];
  
  local_2520._8_8_ = local_2520._0_8_;
  a = &this->Nx;
  dVar162 = y;
  local_23e8 = result;
  ChElementHexaANCF_3813::ShapeFunctionsDerivativeX(this->element,a,x,y,z);
  a_00 = &this->Ny;
  dVar58 = z;
  ChElementHexaANCF_3813::ShapeFunctionsDerivativeY(this->element,a_00,x,dVar162,z);
  pCVar43 = this->element;
  a_01 = &this->Nz;
  ChElementHexaANCF_3813::ShapeFunctionsDerivativeZ(pCVar43,a_01,x,y,dVar58);
  ChElementHexaANCF_3813::Basis_M(pCVar43,&this->M,x,y,z);
  if (this->element->m_isMooney == false) {
    dVar162 = *this->v;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = dVar162;
    auVar52 = vfmadd132sd_fma(auVar52,ZEXT816(0x3ff0000000000000),ZEXT816(0xc000000000000000));
    local_1c80._0_8_ = ((1.0 - dVar162) * *this->E) / ((dVar162 + 1.0) * auVar52._0_8_);
    Eigen::MatrixBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::fillDiagonal
              ((MatrixBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> *)&this->E_eps,1.0);
    pdVar31 = this->v;
    auVar54 = ZEXT816(0x3ff0000000000000);
    auVar61 = ZEXT816(0xc000000000000000);
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[1] = *pdVar31 / (1.0 - *pdVar31);
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[3] = *pdVar31 / (1.0 - *pdVar31);
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[6] = *pdVar31 / (1.0 - *pdVar31);
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[9] = *pdVar31 / (1.0 - *pdVar31);
    auVar55._8_8_ = 0;
    auVar55._0_8_ = *pdVar31;
    auVar52 = vfmadd213sd_fma(auVar61,auVar55,auVar54);
    dVar162 = 1.0 - *pdVar31;
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0xe] = auVar52._0_8_ / (dVar162 + dVar162);
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x12] = *pdVar31 / (1.0 - *pdVar31);
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x13] = *pdVar31 / (1.0 - *pdVar31);
    auVar60._8_8_ = 0;
    auVar60._0_8_ = *pdVar31;
    auVar52 = vfmadd213sd_fma(auVar61,auVar60,auVar54);
    dVar162 = 1.0 - *pdVar31;
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x1c] = auVar52._0_8_ / (dVar162 + dVar162);
    auVar50._8_8_ = 0;
    auVar50._0_8_ = *pdVar31;
    auVar52 = vfmadd213sd_fma(auVar61,auVar50,auVar54);
    dVar162 = 1.0 - *pdVar31;
    (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x23] = auVar52._0_8_ / (dVar162 + dVar162);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator*=
              ((DenseBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> *)&this->E_eps,(Scalar *)local_1c80
              );
  }
  pCVar38 = &this->Sx;
  lVar42 = 0;
  local_2520._0_8_ = pCVar38;
  for (lVar44 = 0; lVar44 != 8; lVar44 = lVar44 + 1) {
    pSVar36 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1> *)a,lVar44);
    SVar1 = *pSVar36;
    pSVar37 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_1> *)pCVar38,0,
                         lVar42);
    *pSVar37 = SVar1;
    pSVar36 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1> *)a,lVar44);
    SVar1 = *pSVar36;
    pSVar37 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_1> *)pCVar38,1,
                         lVar42 + 1);
    *pSVar37 = SVar1;
    pSVar36 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1> *)a,lVar44);
    SVar1 = *pSVar36;
    pSVar37 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_1> *)pCVar38,2,
                         lVar42 + 2);
    lVar42 = lVar42 + 3;
    *pSVar37 = SVar1;
  }
  lVar42 = 0;
  pCVar38 = &this->Sy;
  local_24f0._0_8_ = pCVar38;
  for (lVar44 = 0; lVar44 != 8; lVar44 = lVar44 + 1) {
    pSVar36 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1> *)a_00,lVar44);
    SVar1 = *pSVar36;
    pSVar37 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_1> *)pCVar38,0,
                         lVar42);
    *pSVar37 = SVar1;
    pSVar36 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1> *)a_00,lVar44);
    SVar1 = *pSVar36;
    pSVar37 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_1> *)pCVar38,1,
                         lVar42 + 1);
    *pSVar37 = SVar1;
    pSVar36 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1> *)a_00,lVar44);
    SVar1 = *pSVar36;
    pSVar37 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_1> *)pCVar38,2,
                         lVar42 + 2);
    lVar42 = lVar42 + 3;
    *pSVar37 = SVar1;
  }
  lVar42 = 0;
  pCVar38 = &this->Sz;
  local_2500._0_8_ = pCVar38;
  for (lVar44 = 0; lVar44 != 8; lVar44 = lVar44 + 1) {
    pSVar36 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1> *)a_01,lVar44);
    SVar1 = *pSVar36;
    pSVar37 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_1> *)pCVar38,0,
                         lVar42);
    *pSVar37 = SVar1;
    pSVar36 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1> *)a_01,lVar44);
    SVar1 = *pSVar36;
    pSVar37 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_1> *)pCVar38,1,
                         lVar42 + 1);
    *pSVar37 = SVar1;
    pSVar36 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1> *)a_01,lVar44);
    SVar1 = *pSVar36;
    pSVar37 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_1> *)pCVar38,2,
                         lVar42 + 2);
    lVar42 = lVar42 + 3;
    *pSVar37 = SVar1;
  }
  lVar42 = 0;
  local_15c0._0_8_ = this->d0;
  local_15c0._8_8_ = a;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false,_true> *)
                  local_1c80,(Matrix<double,_3,_3,_1,_3,_3> *)local_e90,0);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,3,1,false>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,8,3,1,8,3>>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,0>>
            ((Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false> *)local_1c80,
             (Product<Eigen::Transpose<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>,_0>
              *)local_15c0);
  local_15c0._0_8_ = this->d0;
  local_15c0._8_8_ = a_00;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false,_true> *)
                  local_1c80,(Matrix<double,_3,_3,_1,_3,_3> *)local_e90,1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,3,1,false>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,8,3,1,8,3>>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,0>>
            ((Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false> *)local_1c80,
             (Product<Eigen::Transpose<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>,_0>
              *)local_15c0);
  local_15c0._0_8_ = this->d0;
  local_15c0._8_8_ = a_01;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false,_true> *)
                  local_1c80,(Matrix<double,_3,_3,_1,_3,_3> *)local_e90,2);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,3,1,false>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,8,3,1,8,3>>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,0>>
            ((Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false> *)local_1c80,
             (Product<Eigen::Transpose<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>,_0>
              *)local_15c0);
  SVar56 = Eigen::internal::determinant_impl<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3>::run
                     ((Matrix<double,_3,_3,_1,_3,_3> *)local_e90);
  this->detJ0 = SVar56;
  auVar142._8_8_ = 0;
  auVar142._0_8_ = local_e90._32_8_;
  auVar152._8_8_ = 0;
  auVar152._0_8_ = local_e90._48_8_;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = local_e90._0_8_;
  auVar132._8_8_ = 0;
  auVar132._0_8_ = local_e90._24_8_;
  auVar163._8_8_ = 0;
  auVar163._0_8_ = local_e90._56_8_;
  auVar91._8_8_ = 0;
  auVar91._0_8_ = local_e90._8_8_;
  auVar167._8_8_ = 0;
  auVar167._0_8_ = (double)local_e90._32_8_ * (double)local_e90._48_8_;
  auVar55 = vfmsub231sd_fma(auVar167,auVar132,auVar163);
  auVar164._8_8_ = 0;
  auVar164._0_8_ = (double)local_e90._56_8_ * (double)local_e90._0_8_;
  auVar60 = vfmsub231sd_fma(auVar164,auVar152,auVar91);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = (double)local_e90._8_8_ * (double)local_e90._24_8_;
  auVar50 = vfmsub231sd_fma(auVar92,auVar54,auVar142);
  auVar143._8_8_ = 0;
  auVar143._0_8_ = (double)local_e90._24_8_ * (double)local_e90._24_8_;
  auVar52 = vfmadd231sd_fma(auVar143,auVar54,auVar54);
  auVar52 = vfmadd231sd_fma(auVar52,auVar152,auVar152);
  auVar52 = vsqrtsd_avx(auVar52,auVar52);
  dVar141 = 1.0 / auVar52._0_8_;
  dVar162 = (double)local_e90._0_8_ * dVar141;
  local_1fc8.m_data[1] = auVar60._0_8_;
  dVar58 = (double)local_e90._24_8_ * dVar141;
  dVar141 = (double)local_e90._48_8_ * dVar141;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = local_1fc8.m_data[1] * local_1fc8.m_data[1];
  auVar52 = vfmadd231sd_fma(auVar61,auVar55,auVar55);
  auVar52 = vfmadd231sd_fma(auVar52,auVar50,auVar50);
  auVar52 = vsqrtsd_avx(auVar52,auVar52);
  local_1fc8.m_data[2] = 1.0 / auVar52._0_8_;
  local_1fc8.m_data[0] = auVar55._0_8_ * local_1fc8.m_data[2];
  local_1fc8.m_data[1] = local_1fc8.m_data[1] * local_1fc8.m_data[2];
  local_1fc8.m_data[2] = auVar50._0_8_ * local_1fc8.m_data[2];
  local_1ff8.m_data[0] = dVar162;
  local_1ff8.m_data[1] = dVar58;
  local_1ff8.m_data[2] = dVar141;
  ChVector<double>::Cross(&local_1fe0,&local_1fc8,&local_1ff8);
  dVar59 = local_1fc8.m_data[0];
  auVar62._8_8_ = 0;
  auVar62._0_8_ = local_1fe0.m_data[0] - dVar162 * 0.0;
  auVar144._8_8_ = 0;
  auVar144._0_8_ = dVar162 + local_1fe0.m_data[0] * 0.0;
  auVar52 = vunpcklpd_avx(auVar144,auVar62);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = local_1fe0.m_data[1] - dVar58 * 0.0;
  auVar153._8_8_ = 0;
  auVar153._0_8_ = dVar58 + local_1fe0.m_data[1] * 0.0;
  auVar55 = vunpcklpd_avx(auVar153,auVar45);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = local_1fe0.m_data[2] - dVar141 * 0.0;
  auVar168._8_8_ = 0;
  auVar168._0_8_ = dVar141 + local_1fe0.m_data[2] * 0.0;
  auVar60 = vunpcklpd_avx(auVar168,auVar46);
  local_2510._0_8_ = local_1fc8.m_data[1];
  local_2540._0_8_ = local_1fc8.m_data[2];
  local_1c80._0_8_ = (non_const_type)local_e90;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
  _set_noalias<Eigen::Inverse<Eigen::Matrix<double,3,3,1,3,3>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)&local_ed8,
             (DenseBase<Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_> *)local_1c80);
  auVar93._8_8_ = local_ed8;
  auVar93._0_8_ = local_ed8;
  auVar145._8_8_ = 0;
  auVar145._0_8_ = dVar59;
  auVar133._8_8_ = 0;
  auVar133._0_8_ = local_2540._0_8_;
  local_15c0._0_8_ = this->T0;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = (double)local_2510._0_8_ * local_ed0;
  auVar50 = vfmadd231sd_fma(auVar47,auVar145,auVar93);
  local_24a0._8_8_ = local_ec8;
  local_24a0._0_8_ = local_ec8;
  auVar62 = vfmadd231sd_fma(auVar50,auVar133,local_24a0);
  local_24c0._8_8_ = local_ec0;
  local_24c0._0_8_ = local_ec0;
  local_24b0._0_8_ = local_eb8;
  local_24b0._8_8_ = local_eb8;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = (double)local_2510._0_8_ * local_eb8;
  auVar50 = vfmadd231sd_fma(auVar49,auVar145,local_24c0);
  local_2400._8_8_ = local_eb0;
  local_2400._0_8_ = local_eb0;
  local_2550 = vfmadd231sd_fma(auVar50,auVar133,local_2400);
  auVar94._8_8_ = local_ea8;
  auVar94._0_8_ = local_ea8;
  local_2410 = local_ea0;
  dStack_2408 = local_ea0;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = (double)local_2510._0_8_ * local_ea0;
  auVar50 = vfmadd231sd_fma(auVar63,auVar94,auVar145);
  local_2310._8_8_ = local_e98;
  local_2310._0_8_ = local_e98;
  local_2540 = vfmadd231sd_fma(auVar50,local_2310,auVar133);
  local_bc0.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.m_data.array[0]
       = *this->detJ0C / this->detJ0;
  local_2510 = auVar94;
  local_15c0._8_8_ = &this->M;
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Matrix<double,6,6,1,6,6>,Eigen::Matrix<double,6,9,1,6,9>,0>>::
  operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_9,_1,_6,_9>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_9,_0,_6,_9>_>_>
             *)local_1c80,
            (MatrixBase<Eigen::Product<Eigen::Matrix<double,6,6,1,6,6>,Eigen::Matrix<double,6,9,1,6,9>,0>>
             *)local_15c0,(double *)&local_bc0);
  dst = &this->G;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,6,9,1,6,9>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Matrix<double,6,6,1,6,6>,Eigen::Matrix<double,6,9,1,6,9>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,9,0,6,9>const>const>>
            (dst,(CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_9,_1,_6,_9>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_9,_0,_6,_9>_>_>
                  *)local_1c80);
  local_1c80._8_8_ = this->alpha_eas;
  local_23f0 = (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&this->strain_EAS;
  local_1c80._0_8_ = dst;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Product<Eigen::Matrix<double,6,9,1,6,9>,Eigen::Matrix<double,9,1,0,9,1>,0>>
            ((Matrix<double,_6,_1,_0,_6,_1> *)local_23f0,
             (Product<Eigen::Matrix<double,_6,_9,_1,_6,_9>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0>
              *)local_1c80);
  local_1c80._0_8_ = this->d;
  local_1c80._8_8_ = local_1c80._0_8_;
  Eigen::PlainObjectBase<Eigen::Matrix<double,8,8,1,8,8>>::
  _set_noalias<Eigen::Product<Eigen::Matrix<double,8,3,1,8,3>,Eigen::Transpose<Eigen::Matrix<double,8,3,1,8,3>>,0>>
            (local_280,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_Eigen::Transpose<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>,_0>_>
              *)local_1c80);
  local_1c80._0_8_ = local_280;
  local_1c80._8_8_ = a;
  Eigen::PlainObjectBase<Eigen::Matrix<double,8,1,0,8,1>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,8,8,1,8,8>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,8,1,0,8,1>> *)local_1dc0,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_8,_8,_1,_8,_8>,_Eigen::Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>,_0>_>
              *)local_1c80);
  local_1c80._0_8_ = local_280;
  local_1c80._8_8_ = a_00;
  Eigen::PlainObjectBase<Eigen::Matrix<double,8,1,0,8,1>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,8,8,1,8,8>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,8,1,0,8,1>> *)local_2100,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_8,_8,_1,_8,_8>,_Eigen::Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>,_0>_>
              *)local_1c80);
  local_1c80._0_8_ = local_280;
  local_1c80._8_8_ = a_01;
  Eigen::PlainObjectBase<Eigen::Matrix<double,8,1,0,8,1>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,8,8,1,8,8>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,8,1,0,8,1>> *)local_2140,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_8,_8,_1,_8,_8>,_Eigen::Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>,_0>_>
              *)local_1c80);
  local_1c80._0_8_ = this->d0;
  local_1c80._8_8_ = local_1c80._0_8_;
  Eigen::PlainObjectBase<Eigen::Matrix<double,8,8,1,8,8>>::
  _set_noalias<Eigen::Product<Eigen::Matrix<double,8,3,1,8,3>,Eigen::Transpose<Eigen::Matrix<double,8,3,1,8,3>>,0>>
            (local_480,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_Eigen::Transpose<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>,_0>_>
              *)local_1c80);
  local_1c80._0_8_ = local_480;
  local_1c80._8_8_ = a;
  Eigen::PlainObjectBase<Eigen::Matrix<double,8,1,0,8,1>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,8,8,1,8,8>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,8,1,0,8,1>> *)local_1e00,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_8,_8,_1,_8,_8>,_Eigen::Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>,_0>_>
              *)local_1c80);
  local_1c80._0_8_ = local_480;
  local_1c80._8_8_ = a_00;
  Eigen::PlainObjectBase<Eigen::Matrix<double,8,1,0,8,1>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,8,8,1,8,8>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,8,1,0,8,1>> *)local_2180,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_8,_8,_1,_8,_8>,_Eigen::Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>,_0>_>
              *)local_1c80);
  local_1c80._0_8_ = local_480;
  local_1c80._8_8_ = a_01;
  Eigen::PlainObjectBase<Eigen::Matrix<double,8,1,0,8,1>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,8,8,1,8,8>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,8,1,0,8,1>> *)local_21c0,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_8,_8,_1,_8,_8>,_Eigen::Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>,_0>_>
              *)local_1c80);
  local_1c80._0_8_ = local_1dc0;
  local_1c80._8_8_ = local_1e00;
  RVar57 = Eigen::internal::
           dot_nocheck<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_8,_1,_0,_8,_1>,_const_Eigen::Matrix<double,_8,_1,_0,_8,_1>_>,_true>
           ::run((MatrixBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_> *)a,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_8,_1,_0,_8,_1>,_const_Eigen::Matrix<double,_8,_1,_0,_8,_1>_>_>
                  *)local_1c80);
  local_2320 = RVar57 * 0.5;
  local_1c80._0_8_ = local_2100;
  local_1c80._8_8_ = local_2180;
  dStack_2318 = 0.0;
  RVar57 = Eigen::internal::
           dot_nocheck<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_8,_1,_0,_8,_1>,_const_Eigen::Matrix<double,_8,_1,_0,_8,_1>_>,_true>
           ::run((MatrixBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_> *)a_00,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_8,_1,_0,_8,_1>,_const_Eigen::Matrix<double,_8,_1,_0,_8,_1>_>_>
                  *)local_1c80);
  local_2330 = RVar57 * 0.5;
  local_1c80._0_8_ = local_2100;
  local_1c80._8_8_ = local_2180;
  dStack_2328 = 0.0;
  local_2340 = Eigen::internal::
               dot_nocheck<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_8,_1,_0,_8,_1>,_const_Eigen::Matrix<double,_8,_1,_0,_8,_1>_>,_true>
               ::run((MatrixBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_> *)a,
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_8,_1,_0,_8,_1>,_const_Eigen::Matrix<double,_8,_1,_0,_8,_1>_>_>
                      *)local_1c80);
  local_1c80._0_8_ = local_2140;
  local_1c80._8_8_ = local_21c0;
  dStack_2338 = extraout_XMM0_Qb;
  RVar57 = Eigen::internal::
           dot_nocheck<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_8,_1,_0,_8,_1>,_const_Eigen::Matrix<double,_8,_1,_0,_8,_1>_>,_true>
           ::run((MatrixBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_> *)a_01,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_8,_1,_0,_8,_1>,_const_Eigen::Matrix<double,_8,_1,_0,_8,_1>_>_>
                  *)local_1c80);
  local_2350 = RVar57 * 0.5;
  local_1c80._8_8_ = local_21c0;
  dStack_2348 = 0.0;
  local_1c80._0_8_ = (non_const_type)local_2140;
  local_2360 = Eigen::internal::
               dot_nocheck<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_8,_1,_0,_8,_1>,_const_Eigen::Matrix<double,_8,_1,_0,_8,_1>_>,_true>
               ::run((MatrixBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_> *)a,
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_8,_1,_0,_8,_1>,_const_Eigen::Matrix<double,_8,_1,_0,_8,_1>_>_>
                      *)local_1c80);
  local_1c80._8_8_ = local_21c0;
  dStack_2358 = extraout_XMM0_Qb_00;
  local_1c80._0_8_ = (non_const_type)local_2140;
  auVar90._0_8_ =
       Eigen::internal::
       dot_nocheck<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_8,_1,_0,_8,_1>,_const_Eigen::Matrix<double,_8,_1,_0,_8,_1>_>,_true>
       ::run((MatrixBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_> *)a_00,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_8,_1,_0,_8,_1>,_const_Eigen::Matrix<double,_8,_1,_0,_8,_1>_>_>
              *)local_1c80);
  auVar90._8_56_ = extraout_var;
  local_2580 = auVar55._0_8_;
  dStack_2578 = auVar55._8_8_;
  auVar48._8_8_ = dStack_2328;
  auVar48._0_8_ = local_2330;
  auVar53._8_8_ = dStack_2318;
  auVar53._0_8_ = local_2320;
  auVar33._8_8_ = dStack_2338;
  auVar33._0_8_ = local_2340;
  auVar51._8_8_ = dStack_2348;
  auVar51._0_8_ = local_2350;
  auVar32._8_8_ = dStack_2358;
  auVar32._0_8_ = local_2360;
  auVar171._0_8_ = local_2580 * (double)local_24b0._0_8_;
  auVar171._8_8_ = dStack_2578 * (double)local_24b0._8_8_;
  auVar170._0_8_ = local_2580 * local_ed0;
  auVar170._8_8_ = dStack_2578 * local_ed0;
  auVar174._0_8_ = local_2580 * local_2410;
  auVar174._8_8_ = dStack_2578 * dStack_2408;
  auVar55 = vfmadd231pd_fma(auVar171,auVar52,local_24c0);
  auVar50 = vfmadd231pd_fma(auVar170,auVar52,auVar93);
  auVar52 = vfmadd231pd_fma(auVar174,auVar52,local_2510);
  local_24d8 = (MatrixBase<Eigen::Matrix<double,6,1,0,6,1>> *)&this->strain;
  auVar54 = vfmadd231pd_fma(auVar55,auVar60,local_2400);
  auVar50 = vfmadd231pd_fma(auVar50,auVar60,local_24a0);
  auVar61 = vfmadd231pd_fma(auVar52,auVar60,local_2310);
  auVar45 = vmulsd_avx512f(auVar62,auVar53);
  dVar59 = auVar54._0_8_;
  dVar172 = auVar54._8_8_;
  dVar58 = auVar50._0_8_;
  auVar95._0_8_ = dVar58 * local_2320;
  dVar141 = auVar50._8_8_;
  auVar95._8_8_ = dVar141 * local_2320;
  auVar52 = vshufpd_avx(auVar54,auVar54,1);
  auVar55 = vshufpd_avx(auVar50,auVar50,1);
  dVar175 = auVar52._0_8_;
  auVar146._0_8_ = dVar59 * dVar59 * local_2330;
  auVar146._8_8_ = dVar172 * dVar172 * local_2330;
  auVar46 = vmovddup_avx512vl(auVar33);
  auVar177._8_8_ = 0;
  auVar177._0_8_ = dVar58 * dVar175;
  auVar53 = vfmadd231sd_fma(auVar177,auVar55,auVar54);
  auVar60 = vfmadd231pd_fma(auVar146,auVar50,auVar95);
  auVar96._0_8_ = dVar58 * auVar46._0_8_;
  auVar96._8_8_ = dVar141 * auVar46._8_8_;
  local_2400._0_8_ = auVar53._0_8_;
  auVar60 = vfmadd213pd_fma(auVar96,auVar54,auVar60);
  dVar173 = auVar61._0_8_;
  auVar154._0_8_ = dVar173 * local_2350;
  auVar154._8_8_ = auVar61._8_8_ * local_2350;
  auVar47 = vmovddup_avx512vl(auVar32);
  auVar165._0_8_ = dVar58 * auVar47._0_8_;
  auVar165._8_8_ = dVar141 * auVar47._8_8_;
  auVar60 = vfmadd213pd_fma(auVar154,auVar61,auVar60);
  auVar97._8_8_ = auVar90._0_8_;
  auVar97._0_8_ = auVar90._0_8_;
  auVar60 = vfmadd213pd_fma(auVar165,auVar61,auVar60);
  auVar155._0_8_ = dVar59 * auVar90._0_8_;
  auVar155._8_8_ = dVar172 * auVar90._0_8_;
  auVar60 = vfmadd213pd_fma(auVar155,auVar61,auVar60);
  auVar48 = vmulsd_avx512f(local_2550,auVar48);
  auVar48 = vmulsd_avx512f(local_2550,auVar48);
  *(undefined1 (*) [16])
   (this->strain).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
   array = auVar60;
  auVar60 = vshufpd_avx(auVar61,auVar61,1);
  auVar49 = vmulsd_avx512f(auVar54,auVar60);
  dVar162 = dVar59 * (local_2330 + local_2330);
  auVar50 = vmulsd_avx512f(auVar50,auVar60);
  auVar48 = vfmadd231sd_avx512f(auVar48,auVar62,auVar45);
  auVar45 = vmulsd_avx512f(auVar62,auVar33);
  auVar49 = vfmadd231sd_avx512f(auVar49,auVar52,auVar61);
  auVar50 = vfmadd231sd_avx512f(auVar50,auVar55,auVar61);
  auVar156._0_8_ = dVar58 * (local_2320 + local_2320);
  auVar156._8_8_ = dVar141 * (local_2320 + local_2320);
  auVar169._0_8_ = dVar173 * (local_2350 + local_2350);
  auVar169._8_8_ = auVar61._8_8_ * (local_2350 + local_2350);
  auVar48 = vfmadd213sd_avx512f(auVar45,local_2550,auVar48);
  auVar176._8_8_ = 0;
  auVar176._0_8_ = dVar175 * dVar162;
  auVar52 = vfmadd231sd_fma(auVar176,auVar156,auVar55);
  vmovsd_avx512f(auVar50);
  vmovsd_avx512f(auVar49);
  auVar51 = vmulsd_avx512f(local_2540,auVar51);
  auVar52 = vfmadd231sd_avx512f(auVar52,auVar53,auVar33);
  auVar53 = vfmadd213sd_avx512f(auVar51,local_2540,auVar48);
  auVar51 = vmulsd_avx512f(auVar62,auVar32);
  auVar52 = vfmadd231sd_fma(auVar52,auVar169,auVar60);
  auVar53 = vfmadd213sd_avx512f(auVar51,local_2540,auVar53);
  auVar51 = vmulsd_avx512f(local_2550,auVar90._0_16_);
  auVar52 = vfmadd231sd_avx512f(auVar52,auVar50,auVar32);
  auVar50 = vfmadd213sd_avx512f(auVar51,local_2540,auVar53);
  auVar52 = vfmadd231sd_avx512f(auVar52,auVar49,auVar90._0_16_);
  auVar53 = vmovddup_avx512vl(local_2550);
  (this->strain).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
  [3] = auVar50._0_8_;
  auVar50 = vmovddup_avx512vl(auVar62);
  auVar166._0_8_ = auVar53._0_8_ * dVar162;
  auVar166._8_8_ = auVar53._8_8_ * dVar172 * (local_2330 + local_2330);
  (this->strain).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
  [2] = auVar52._0_8_;
  auVar52 = vfmadd231pd_fma(auVar166,auVar50,auVar156);
  auVar157._0_8_ = dVar58 * auVar53._0_8_;
  auVar157._8_8_ = dVar141 * auVar53._8_8_;
  local_24a0 = vfmadd231pd_fma(auVar157,auVar50,auVar54);
  auVar52 = vfmadd231pd_fma(auVar52,local_24a0,auVar46);
  auVar54 = vmovddup_avx512vl(local_2540);
  auVar158._0_8_ = dVar58 * auVar54._0_8_;
  auVar158._8_8_ = dVar141 * auVar54._8_8_;
  auVar52 = vfmadd231pd_fma(auVar52,auVar54,auVar169);
  auVar134._0_8_ = dVar59 * auVar54._0_8_;
  auVar134._8_8_ = dVar172 * auVar54._8_8_;
  local_24b0 = vfmadd231pd_fma(auVar158,auVar61,auVar50);
  local_24c0 = vfmadd231pd_fma(auVar134,auVar53,auVar61);
  auVar52 = vfmadd231pd_fma(auVar52,local_24b0,auVar47);
  auVar52 = vfmadd231pd_fma(auVar52,local_24c0,auVar97);
  *(undefined1 (*) [16])
   ((this->strain).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
    array + 4) = auVar52;
  local_15c0._8_8_ = this->d;
  local_15b0.m_other = (double)local_2520._0_8_;
  local_15c0._0_8_ = a;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true,_true> *)
                  local_1c80,&local_bc0,0);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,6,24,1,6,24>,1,24,true>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,1,8,1,1,8>,Eigen::Matrix<double,8,3,1,8,3>,0>,Eigen::Matrix<double,3,24,1,3,24>,0>>
            ((Block<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true> *)local_1c80,
             (Product<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_3,_1,_8,_3>,_0>,_Eigen::Matrix<double,_3,_24,_1,_3,_24>,_0>
              *)local_15c0);
  uVar34 = local_24f0._0_8_;
  local_15c0._8_8_ = this->d;
  local_15b0.m_other = (double)local_24f0._0_8_;
  local_15c0._0_8_ = a_00;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true,_true> *)
                  local_1c80,&local_bc0,1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,6,24,1,6,24>,1,24,true>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,1,8,1,1,8>,Eigen::Matrix<double,8,3,1,8,3>,0>,Eigen::Matrix<double,3,24,1,3,24>,0>>
            ((Block<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true> *)local_1c80,
             (Product<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_3,_1,_8,_3>,_0>,_Eigen::Matrix<double,_3,_24,_1,_3,_24>,_0>
              *)local_15c0);
  local_1c80._8_8_ = this->d;
  local_1c70.m_other = (double)uVar34;
  local_1c58.m_other = (double)local_2520._0_8_;
  local_1c80._0_8_ = a;
  local_1c68.m_other = (double)a_00;
  local_1c60.m_other = (double)local_1c80._8_8_;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true,_true> *)
                  local_15c0,&local_bc0,2);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,6,24,1,6,24>,1,24,true>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,1,8,1,1,8>,Eigen::Matrix<double,8,3,1,8,3>,0>,Eigen::Matrix<double,3,24,1,3,24>,0>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,1,8,1,1,8>,Eigen::Matrix<double,8,3,1,8,3>,0>,Eigen::Matrix<double,3,24,1,3,24>,0>const>>
            ((Block<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true> *)local_15c0,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_3,_1,_8,_3>,_0>,_Eigen::Matrix<double,_3,_24,_1,_3,_24>,_0>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_3,_1,_8,_3>,_0>,_Eigen::Matrix<double,_3,_24,_1,_3,_24>,_0>_>
              *)local_1c80);
  local_15c0._8_8_ = this->d;
  uVar34 = local_2500._0_8_;
  local_15b0.m_other = (double)local_2500._0_8_;
  local_15c0._0_8_ = a_01;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true,_true> *)
                  local_1c80,&local_bc0,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,6,24,1,6,24>,1,24,true>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,1,8,1,1,8>,Eigen::Matrix<double,8,3,1,8,3>,0>,Eigen::Matrix<double,3,24,1,3,24>,0>>
            ((Block<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true> *)local_1c80,
             (Product<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_3,_1,_8,_3>,_0>,_Eigen::Matrix<double,_3,_24,_1,_3,_24>,_0>
              *)local_15c0);
  local_1c80._8_8_ = this->d;
  local_1c70.m_other = (double)uVar34;
  local_1c58.m_other = (double)local_2520._0_8_;
  local_1c80._0_8_ = a;
  local_1c68.m_other = (double)a_01;
  local_1c60.m_other = (double)local_1c80._8_8_;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true,_true> *)
                  local_15c0,&local_bc0,4);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,6,24,1,6,24>,1,24,true>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,1,8,1,1,8>,Eigen::Matrix<double,8,3,1,8,3>,0>,Eigen::Matrix<double,3,24,1,3,24>,0>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,1,8,1,1,8>,Eigen::Matrix<double,8,3,1,8,3>,0>,Eigen::Matrix<double,3,24,1,3,24>,0>const>>
            ((Block<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true> *)local_15c0,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_3,_1,_8,_3>,_0>,_Eigen::Matrix<double,_3,_24,_1,_3,_24>,_0>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_3,_1,_8,_3>,_0>,_Eigen::Matrix<double,_3,_24,_1,_3,_24>,_0>_>
              *)local_1c80);
  local_1c80._8_8_ = this->d;
  local_1c70.m_other = (double)local_2500._0_8_;
  local_1c58.m_other = (double)local_24f0._0_8_;
  local_1c80._0_8_ = a_00;
  local_1c68.m_other = (double)a_01;
  local_1c60.m_other = (double)local_1c80._8_8_;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true,_true> *)
                  local_15c0,&local_bc0,5);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,6,24,1,6,24>,1,24,true>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,1,8,1,1,8>,Eigen::Matrix<double,8,3,1,8,3>,0>,Eigen::Matrix<double,3,24,1,3,24>,0>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,1,8,1,1,8>,Eigen::Matrix<double,8,3,1,8,3>,0>,Eigen::Matrix<double,3,24,1,3,24>,0>const>>
            ((Block<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true> *)local_15c0,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_3,_1,_8,_3>,_0>,_Eigen::Matrix<double,_3,_24,_1,_3,_24>,_0>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_3,_1,_8,_3>,_0>,_Eigen::Matrix<double,_3,_24,_1,_3,_24>,_0>_>
              *)local_1c80);
  local_2520 = vpermilpd_avx(local_24c0,1);
  local_24f0 = vpermilpd_avx(local_24b0,1);
  local_2500 = vpermilpd_avx(local_24a0,1);
  this_01 = &this->strainD;
  for (; pMVar35 = local_24d8, lVar42 != 0x18; lVar42 = lVar42 + 1) {
    pSVar39 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_bc0,0,
                         lVar42);
    dVar162 = *pSVar39;
    pSVar39 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_bc0,1,
                         lVar42);
    auVar135._8_8_ = 0;
    auVar135._0_8_ = dVar58 * dVar162;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = dVar58;
    auVar64._8_8_ = 0;
    auVar64._0_8_ = dVar59 * dVar59 * *pSVar39;
    auVar52 = vfmadd231sd_fma(auVar64,auVar135,auVar2);
    pSVar39 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_bc0,2,
                         lVar42);
    auVar98._8_8_ = 0;
    auVar98._0_8_ = auVar52._0_8_;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = dVar59;
    auVar65._8_8_ = 0;
    auVar65._0_8_ = dVar58 * *pSVar39;
    auVar52 = vfmadd132sd_fma(auVar65,auVar98,auVar3);
    pSVar39 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_bc0,3,
                         lVar42);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = auVar52._0_8_;
    auVar99._8_8_ = 0;
    auVar99._0_8_ = dVar173 * *pSVar39;
    auVar52 = vfmadd213sd_fma(auVar99,auVar61,auVar4);
    auVar100._0_8_ = auVar52._0_8_;
    pSVar39 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_bc0,4,
                         lVar42);
    auVar100._8_8_ = 0;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = dVar173;
    auVar66._8_8_ = 0;
    auVar66._0_8_ = dVar58 * *pSVar39;
    auVar52 = vfmadd132sd_fma(auVar66,auVar100,auVar5);
    pSVar39 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_bc0,5,
                         lVar42);
    auVar101._8_8_ = 0;
    auVar101._0_8_ = auVar52._0_8_;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = dVar173;
    auVar67._8_8_ = 0;
    auVar67._0_8_ = dVar59 * *pSVar39;
    auVar52 = vfmadd132sd_fma(auVar67,auVar101,auVar6);
    pSVar39 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)this_01,0,
                         lVar42);
    *pSVar39 = auVar52._0_8_;
    pSVar39 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_bc0,0,
                         lVar42);
    local_25e0 = auVar55._0_8_;
    dVar162 = *pSVar39;
    pSVar39 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_bc0,1,
                         lVar42);
    auVar136._8_8_ = 0;
    auVar136._0_8_ = local_25e0 * dVar162;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_25e0;
    auVar68._8_8_ = 0;
    auVar68._0_8_ = dVar175 * dVar175 * *pSVar39;
    auVar52 = vfmadd231sd_fma(auVar68,auVar136,auVar7);
    pSVar39 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_bc0,2,
                         lVar42);
    auVar102._8_8_ = 0;
    auVar102._0_8_ = auVar52._0_8_;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = dVar175;
    auVar69._8_8_ = 0;
    auVar69._0_8_ = local_25e0 * *pSVar39;
    auVar52 = vfmadd132sd_fma(auVar69,auVar102,auVar8);
    pSVar39 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_bc0,3,
                         lVar42);
    dVar141 = auVar60._0_8_;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = auVar52._0_8_;
    auVar103._8_8_ = 0;
    auVar103._0_8_ = dVar141 * *pSVar39;
    auVar52 = vfmadd213sd_fma(auVar103,auVar60,auVar9);
    auVar104._0_8_ = auVar52._0_8_;
    pSVar39 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_bc0,4,
                         lVar42);
    auVar104._8_8_ = 0;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = dVar141;
    auVar70._8_8_ = 0;
    auVar70._0_8_ = local_25e0 * *pSVar39;
    auVar52 = vfmadd132sd_fma(auVar70,auVar104,auVar10);
    pSVar39 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_bc0,5,
                         lVar42);
    auVar105._8_8_ = 0;
    auVar105._0_8_ = auVar52._0_8_;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = dVar141;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = dVar175 * *pSVar39;
    auVar52 = vfmadd132sd_fma(auVar71,auVar105,auVar11);
    pSVar39 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)this_01,1,
                         lVar42);
    *pSVar39 = auVar52._0_8_;
    pSVar39 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_bc0,0,
                         lVar42);
    dVar162 = *pSVar39;
    pSVar39 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_bc0,1,
                         lVar42);
    auVar106._8_8_ = 0;
    auVar106._0_8_ = (dVar162 + dVar162) * dVar58;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = local_25e0;
    auVar72._8_8_ = 0;
    auVar72._0_8_ = (*pSVar39 + *pSVar39) * dVar59 * dVar175;
    auVar52 = vfmadd231sd_fma(auVar72,auVar106,auVar12);
    pSVar39 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_bc0,2,
                         lVar42);
    auVar73._8_8_ = 0;
    auVar73._0_8_ = local_2400._0_8_;
    auVar107._8_8_ = 0;
    auVar107._0_8_ = auVar52._0_8_;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = *pSVar39;
    auVar52 = vfmadd231sd_fma(auVar107,auVar73,auVar13);
    auVar108._0_8_ = auVar52._0_8_;
    pSVar39 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_bc0,3,
                         lVar42);
    auVar108._8_8_ = 0;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = dVar141;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = (*pSVar39 + *pSVar39) * dVar173;
    auVar52 = vfmadd132sd_fma(auVar74,auVar108,auVar14);
    pSVar39 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_bc0,4,
                         lVar42);
    auVar75._8_8_ = 0;
    auVar75._0_8_ = local_2410;
    auVar109._8_8_ = 0;
    auVar109._0_8_ = auVar52._0_8_;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = *pSVar39;
    auVar52 = vfmadd231sd_fma(auVar109,auVar75,auVar15);
    auVar110._0_8_ = auVar52._0_8_;
    pSVar39 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_bc0,5,
                         lVar42);
    auVar76._8_8_ = 0;
    auVar76._0_8_ = local_2510._0_8_;
    auVar110._8_8_ = 0;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = *pSVar39;
    auVar52 = vfmadd231sd_fma(auVar110,auVar76,auVar16);
    pSVar39 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)this_01,2,
                         lVar42);
    *pSVar39 = auVar52._0_8_;
    pSVar39 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_bc0,0,
                         lVar42);
    local_25f0 = auVar62._0_8_;
    dVar162 = *pSVar39;
    pSVar39 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_bc0,1,
                         lVar42);
    auVar137._8_8_ = 0;
    auVar137._0_8_ = local_25f0 * dVar162;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = local_25f0;
    auVar77._8_8_ = 0;
    auVar77._0_8_ = (double)local_2550._0_8_ * (double)local_2550._0_8_ * *pSVar39;
    auVar52 = vfmadd231sd_fma(auVar77,auVar137,auVar17);
    pSVar39 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_bc0,2,
                         lVar42);
    auVar111._8_8_ = 0;
    auVar111._0_8_ = auVar52._0_8_;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = local_2550._0_8_;
    auVar78._8_8_ = 0;
    auVar78._0_8_ = local_25f0 * *pSVar39;
    auVar52 = vfmadd132sd_fma(auVar78,auVar111,auVar18);
    pSVar39 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_bc0,3,
                         lVar42);
    auVar19._8_8_ = 0;
    auVar19._0_8_ = auVar52._0_8_;
    auVar112._8_8_ = 0;
    auVar112._0_8_ = local_2540._0_8_ * *pSVar39;
    auVar52 = vfmadd213sd_fma(auVar112,local_2540,auVar19);
    pSVar39 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_bc0,4,
                         lVar42);
    auVar20._8_8_ = 0;
    auVar20._0_8_ = auVar52._0_8_;
    auVar79._8_8_ = 0;
    auVar79._0_8_ = local_25f0 * *pSVar39;
    auVar52 = vfmadd213sd_fma(auVar79,local_2540,auVar20);
    auVar138._8_8_ = 0;
    auVar138._0_8_ =
         (double)local_2550._0_8_ *
         local_bc0.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.m_data.
         array[5];
    auVar52 = vfmadd213sd_fma(auVar138,local_2540,auVar52);
    pSVar39 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)this_01,3,
                         lVar42);
    *pSVar39 = auVar52._0_8_;
    pSVar39 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_bc0,0,
                         lVar42);
    dVar162 = *pSVar39;
    pSVar39 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_bc0,1,
                         lVar42);
    auVar113._8_8_ = 0;
    auVar113._0_8_ = (dVar162 + dVar162) * dVar58;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = local_25f0;
    auVar80._8_8_ = 0;
    auVar80._0_8_ = (*pSVar39 + *pSVar39) * dVar59 * (double)local_2550._0_8_;
    auVar52 = vfmadd231sd_fma(auVar80,auVar113,auVar21);
    pSVar39 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_bc0,2,
                         lVar42);
    auVar114._8_8_ = 0;
    auVar114._0_8_ = auVar52._0_8_;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = *pSVar39;
    auVar52 = vfmadd231sd_fma(auVar114,local_24a0,auVar22);
    auVar115._0_8_ = auVar52._0_8_;
    pSVar39 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_bc0,3,
                         lVar42);
    auVar115._8_8_ = 0;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = local_2540._0_8_;
    auVar81._8_8_ = 0;
    auVar81._0_8_ = (*pSVar39 + *pSVar39) * dVar173;
    auVar52 = vfmadd132sd_fma(auVar81,auVar115,auVar23);
    pSVar39 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_bc0,4,
                         lVar42);
    auVar116._8_8_ = 0;
    auVar116._0_8_ = auVar52._0_8_;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = *pSVar39;
    auVar52 = vfmadd231sd_fma(auVar116,local_24b0,auVar24);
    auVar117._0_8_ = auVar52._0_8_;
    pSVar39 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_bc0,5,
                         lVar42);
    auVar117._8_8_ = 0;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = *pSVar39;
    auVar52 = vfmadd231sd_fma(auVar117,local_24c0,auVar25);
    pSVar39 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)this_01,4,
                         lVar42);
    *pSVar39 = auVar52._0_8_;
    pSVar39 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_bc0,0,
                         lVar42);
    dVar162 = *pSVar39;
    pSVar39 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_bc0,1,
                         lVar42);
    auVar118._8_8_ = 0;
    auVar118._0_8_ = (dVar162 + dVar162) * local_25e0;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = local_25f0;
    auVar82._8_8_ = 0;
    auVar82._0_8_ = (*pSVar39 + *pSVar39) * dVar175 * (double)local_2550._0_8_;
    auVar52 = vfmadd231sd_fma(auVar82,auVar118,auVar26);
    pSVar39 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_bc0,2,
                         lVar42);
    auVar119._8_8_ = 0;
    auVar119._0_8_ = auVar52._0_8_;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = *pSVar39;
    auVar52 = vfmadd231sd_fma(auVar119,local_2500,auVar27);
    auVar120._0_8_ = auVar52._0_8_;
    pSVar39 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_bc0,3,
                         lVar42);
    auVar120._8_8_ = 0;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = local_2540._0_8_;
    auVar83._8_8_ = 0;
    auVar83._0_8_ = (*pSVar39 + *pSVar39) * dVar141;
    auVar52 = vfmadd132sd_fma(auVar83,auVar120,auVar28);
    pSVar39 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_bc0,4,
                         lVar42);
    auVar121._8_8_ = 0;
    auVar121._0_8_ = auVar52._0_8_;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = *pSVar39;
    auVar52 = vfmadd231sd_fma(auVar121,local_24f0,auVar29);
    auVar122._0_8_ = auVar52._0_8_;
    pSVar39 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_bc0,5,
                         lVar42);
    auVar122._8_8_ = 0;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = *pSVar39;
    auVar52 = vfmadd231sd_fma(auVar122,local_2520,auVar30);
    pSVar39 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)this_01,5,
                         lVar42);
    *pSVar39 = auVar52._0_8_;
  }
  Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+=(local_24d8,local_23f0);
  if (this->element->m_isMooney == false) {
    local_1c80._0_8_ = dst;
    local_1c80._8_8_ = &this->E_eps;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,9,6,1,9,6>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,9,1,6,9>>,Eigen::Matrix<double,6,6,1,6,6>,0>>
              ((Matrix<double,_9,_6,_1,_9,_6> *)local_1fb0,
               (Product<Eigen::Transpose<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>,_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0>
                *)local_1c80);
    local_1c70.m_other = (double)pMVar35;
    local_1c80._0_8_ = this_01;
    local_1c80._8_8_ = &this->E_eps;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,24,1,0,24,1>,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,24,1,6,24>>,Eigen::Matrix<double,6,6,1,6,6>,0>,Eigen::Matrix<double,6,1,0,6,1>,0>>
              (&this->Fint,
               (Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>,_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>
                *)local_1c80);
    pCVar43 = this->element;
    auVar125._0_8_ = (pCVar43->m_InertFlexVec).m_data[1] * 0.5;
    auVar125._8_8_ = (pCVar43->m_InertFlexVec).m_data[2] * 0.5;
    auVar52 = vshufpd_avx(auVar125,auVar125,1);
    local_1c80._0_8_ =
         (pCVar43->m_InertFlexVec).m_data[0] * 0.5 * this->detJ0 * auVar125._0_8_ * auVar52._0_8_;
    Eigen::DenseBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>::operator*=
              ((DenseBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_> *)&this->Fint,
               (Scalar *)local_1c80);
    local_1c80._8_8_ = pMVar35;
    local_1c80._0_8_ = (non_const_type)local_1fb0;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,9,1,0,9,1>,Eigen::Product<Eigen::Matrix<double,9,6,1,9,6>,Eigen::Matrix<double,6,1,0,6,1>,0>>
              (&local_23a8,
               (Product<Eigen::Matrix<double,_9,_6,_1,_9,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>
                *)local_1c80);
  }
  else {
    auVar60 = ZEXT816(0x4000000000000000);
    auVar84._8_8_ = 0;
    auVar84._0_8_ =
         (this->strain).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
         m_data.array[0];
    auVar55 = ZEXT816(0x3ff0000000000000);
    auVar52 = vfmadd132sd_fma(auVar84,auVar55,auVar60);
    local_708._0_8_ = auVar52._0_8_;
    auVar85._8_8_ = 0;
    auVar85._0_8_ =
         (this->strain).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
         m_data.array[1];
    auVar52 = vfmadd132sd_fma(auVar85,auVar55,auVar60);
    local_708._32_8_ = auVar52._0_8_;
    auVar86._8_8_ = 0;
    auVar86._0_8_ =
         (this->strain).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
         m_data.array[3];
    auVar52 = vfmadd132sd_fma(auVar86,auVar55,auVar60);
    local_6c8 = auVar52._0_8_;
    local_708._8_8_ =
         (this->strain).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
         m_data.array[2];
    unique0x00006c80 =
         *(undefined1 (*) [16])
          ((this->strain).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
           m_data.array + 4);
    local_708._40_8_ =
         (this->strain).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
         m_data.array[5];
    local_708._16_8_ = vmovlps_avx(unique0x00006c80);
    local_1c80._0_8_ = (non_const_type)local_708;
    local_708._24_8_ = local_708._8_8_;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Inverse<Eigen::Matrix<double,3,3,1,3,3>>>
              ((Matrix<double,_3,_3,_1,_3,_3> *)&local_e48,
               (Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)local_1c80);
    auVar87._8_8_ = 0;
    auVar87._0_8_ = local_708._32_8_;
    auVar180._8_8_ = 0;
    auVar180._0_8_ = dStack_6d0;
    auVar178._8_8_ = 0;
    auVar178._0_8_ = local_708._16_8_;
    auVar159._8_8_ = 0;
    auVar159._0_8_ = local_6c8;
    auVar182._8_8_ = 0;
    auVar182._0_8_ = local_708._48_8_;
    auVar52 = vmulsd_avx512f(auVar182,auVar182);
    dVar162 = (double)local_708._0_8_ + (double)local_708._32_8_ + local_6c8;
    local_2528 = (dVar162 * dVar162 -
                 (local_6c8 * local_6c8 +
                 (double)local_708._40_8_ * (double)local_708._40_8_ +
                 (double)local_708._16_8_ * (double)local_708._16_8_ +
                 dStack_6d0 * dStack_6d0 +
                 (double)local_708._32_8_ * (double)local_708._32_8_ +
                 (double)local_708._8_8_ * (double)local_708._8_8_ +
                 auVar52._0_8_ +
                 (double)local_708._0_8_ * (double)local_708._0_8_ +
                 (double)local_708._24_8_ * (double)local_708._24_8_)) * 0.5;
    auVar183._8_8_ = 0;
    auVar183._0_8_ = local_708._48_8_;
    auVar55 = vmulsd_avx512f(auVar87,auVar183);
    auVar123._8_8_ = 0;
    auVar123._0_8_ = dStack_6d0 * (double)local_708._40_8_ * (double)local_708._0_8_;
    auVar147._8_8_ = 0;
    auVar147._0_8_ = (double)local_708._0_8_ * (double)local_708._32_8_;
    auVar52 = vfmsub231sd_fma(auVar123,auVar159,auVar147);
    auVar148._8_8_ = 0;
    auVar148._0_8_ = (double)local_708._40_8_ * (double)local_708._8_8_;
    auVar52 = vfmadd213sd_avx512f(auVar148,auVar183,auVar52);
    auVar124._8_8_ = 0;
    auVar124._0_8_ = (double)local_708._24_8_ * (double)local_708._8_8_;
    auVar52 = vfnmadd213sd_fma(auVar124,auVar159,auVar52);
    auVar139._8_8_ = 0;
    auVar139._0_8_ = (double)local_708._16_8_ * (double)local_708._24_8_;
    auVar52 = vfmadd213sd_fma(auVar139,auVar180,auVar52);
    auVar52 = vfnmadd213sd_fma(auVar55,auVar178,auVar52);
    dVar58 = auVar52._0_8_;
    local_2558 = dVar162;
    if (dVar58 < 0.0) {
      dVar141 = sqrt(dVar58);
    }
    else {
      auVar52 = vsqrtsd_avx(auVar52,auVar52);
      dVar141 = auVar52._0_8_;
    }
    dVar59 = this->element->CCOM1 + this->element->CCOM2;
    dVar59 = (dVar59 + dVar59) / 0.020000000000000018;
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::Identity();
    local_23a8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
    [0] = dVar162 * 0.3333333333333333;
    Eigen::MatrixBase<Eigen::Matrix<double,3,3,1,3,3>>::operator*
              ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                *)local_1fb0,(MatrixBase<Eigen::Matrix<double,3,3,1,3,3>> *)&local_e48,
               (double *)&local_23a8);
    local_15c0._8_8_ = local_1fb0._0_8_;
    local_15a8.m_value = local_1fb0._16_8_;
    local_2040[0] = pow(dVar58,-0.3333333333333333);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,1,3,3>>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,1,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>const>>
    ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                 *)local_1c80,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,1,3,3>>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,1,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>const>>
                 *)local_15c0,local_2040);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,1,3,3>>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,1,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>>
              (&local_22b8,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                *)local_1c80);
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::Identity();
    Eigen::
    MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,1,3,3>>>
    ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                 *)&local_23a8,
                (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,1,3,3>>>
                 *)&local_2250,&local_2558);
    dVar162 = local_23a8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2];
    local_1cc8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [0] = 0.6666666666666666;
    Eigen::MatrixBase<Eigen::Matrix<double,3,3,1,3,3>>::operator*
              ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                *)&local_2208,(MatrixBase<Eigen::Matrix<double,3,3,1,3,3>> *)&local_e48,
               (double *)&local_1cc8);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,1,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>>
    ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                 *)local_1fb0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,1,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>>
                 *)&local_2208,&local_2528);
    local_15a0.m_value = (long)dVar162;
    local_1578 = (LhsNested)local_1fb0._8_8_;
    local_1568 = (double)local_1fb0._24_8_;
    local_1550 = (double)local_1fb0._48_8_;
    local_1590 = (non_const_type)local_708;
    local_2488._0_8_ = pow(dVar58,-0.6666666666666666);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,1,3,3>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>const,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,1,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>const>>
    ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                 *)local_1c80,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,1,3,3>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>const,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,1,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>const>>
                 *)local_15c0,(double *)local_2488);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,1,3,3>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>const,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,1,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>>
              ((Matrix<double,_3,_3,_1,_3,_3> *)local_2040,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                *)local_1c80);
    local_15c0._0_8_ = dVar141 * 0.5;
    Eigen::MatrixBase<Eigen::Matrix<double,3,3,1,3,3>>::operator*
              ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                *)local_1c80,(MatrixBase<Eigen::Matrix<double,3,3,1,3,3>> *)&local_e48,
               (double *)local_15c0);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,1,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>>
              (&local_2208,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                *)local_1c80);
    local_2250.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [0] = this->element->CCOM1;
    local_2250.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [0] = local_2250.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[0] +
          local_2250.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[0];
    Eigen::MatrixBase<Eigen::Matrix<double,3,3,1,3,3>>::operator*
              ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                *)local_1fb0,(MatrixBase<Eigen::Matrix<double,3,3,1,3,3>> *)&local_22b8,
               (double *)&local_2250);
    local_2088.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [0] = this->element->CCOM2;
    local_2088.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [0] = local_2088.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[0] +
          local_2088.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[0];
    Eigen::MatrixBase<Eigen::Matrix<double,3,3,1,3,3>>::operator*
              ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                *)&local_23a8,(MatrixBase<Eigen::Matrix<double,3,3,1,3,3>> *)local_2040,
               (double *)&local_2088);
    local_15c0._8_8_ = local_1fb0._0_8_;
    local_15a8.m_value = local_1fb0._16_8_;
    local_1598 = (ChMatrixNM<double,_6,_24> *)
                 local_23a8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                 m_data.array[0];
    local_1588 = local_23a8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                 m_data.array[2];
    local_1d10[0] = (dVar141 + -1.0) * dVar59;
    local_1d10[0] = local_1d10[0] + local_1d10[0];
    Eigen::MatrixBase<Eigen::Matrix<double,3,3,1,3,3>>::operator*
              ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                *)local_2488,(MatrixBase<Eigen::Matrix<double,3,3,1,3,3>> *)&local_2208,local_1d10);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,1,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,1,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>
                 *)local_1c80,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,1,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,1,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>const>>
                 *)local_15c0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>
                 *)local_2488);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,1,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,1,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,1,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>const>>
              (&local_1cc8,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>
                *)local_1c80);
    this_00 = &this->E_eps;
    local_2440 = local_1cc8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[0];
    local_2438 = local_1cc8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[4];
    local_2430 = local_1cc8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[1];
    local_2428 = local_1cc8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[8];
    local_2420 = local_1cc8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[2];
    local_2418 = local_1cc8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[5];
    Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> *)this_00);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Matrix<double,6,1,0,6,1>>
              (&local_23e0,(Matrix<double,_6,_1,_0,_6,_1> *)local_24d8);
    for (lVar42 = 0; lVar42 != 6; lVar42 = lVar42 + 1) {
      pSVar40 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)&local_23e0,
                           lVar42);
      dVar162 = *pSVar40;
      pSVar40 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)&local_23e0,
                           lVar42);
      auVar60 = ZEXT816(0x3ff0000000000000);
      auVar50 = ZEXT816(0x4000000000000000);
      *pSVar40 = dVar162 + 1e-06;
      local_1c80._0_8_ = local_2488;
      auVar88._8_8_ = 0;
      auVar88._0_8_ =
           local_23e0.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
           array[0];
      auVar160._8_8_ = 0;
      auVar160._0_8_ =
           local_23e0.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
           array[1];
      auVar149._8_8_ = 0;
      auVar149._0_8_ =
           local_23e0.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
           array[3];
      auVar52 = vfmadd132sd_fma(auVar88,auVar60,auVar50);
      auVar55 = vfmadd132sd_fma(auVar160,auVar60,auVar50);
      auVar60 = vfmadd132sd_fma(auVar149,auVar60,auVar50);
      dStack_2450 = local_23e0.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                    m_storage.m_data.array[5];
      local_2488._48_8_ =
           local_23e0.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
           array[4];
      local_2488._0_8_ = auVar52._0_8_;
      local_2488._32_8_ = auVar55._0_8_;
      local_2448 = auVar60._0_8_;
      local_2488._24_8_ =
           local_23e0.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
           array[2];
      local_2488._8_8_ =
           local_23e0.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
           array[2];
      local_2488._16_8_ = vmovlps_avx(unique0x10001b9e);
      local_2488._40_8_ =
           local_23e0.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
           array[5];
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Inverse<Eigen::Matrix<double,3,3,1,3,3>>>
                (&local_2250,(Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)local_1c80);
      auVar89._8_8_ = 0;
      auVar89._0_8_ = local_2488._32_8_;
      auVar181._8_8_ = 0;
      auVar181._0_8_ = dStack_2450;
      auVar179._8_8_ = 0;
      auVar179._0_8_ = local_2488._16_8_;
      auVar161._8_8_ = 0;
      auVar161._0_8_ = local_2448;
      auVar184._8_8_ = 0;
      auVar184._0_8_ = local_2488._48_8_;
      auVar52 = vmulsd_avx512f(auVar184,auVar184);
      local_2558 = (double)local_2488._0_8_ + (double)local_2488._32_8_ + local_2448;
      local_2528 = (local_2558 * local_2558 -
                   (local_2448 * local_2448 +
                   (double)local_2488._40_8_ * (double)local_2488._40_8_ +
                   (double)local_2488._16_8_ * (double)local_2488._16_8_ +
                   dStack_2450 * dStack_2450 +
                   (double)local_2488._32_8_ * (double)local_2488._32_8_ +
                   (double)local_2488._8_8_ * (double)local_2488._8_8_ +
                   auVar52._0_8_ +
                   (double)local_2488._0_8_ * (double)local_2488._0_8_ +
                   (double)local_2488._24_8_ * (double)local_2488._24_8_)) * 0.5;
      auVar185._8_8_ = 0;
      auVar185._0_8_ = local_2488._48_8_;
      auVar55 = vmulsd_avx512f(auVar89,auVar185);
      auVar126._8_8_ = 0;
      auVar126._0_8_ = dStack_2450 * (double)local_2488._40_8_ * (double)local_2488._0_8_;
      auVar150._8_8_ = 0;
      auVar150._0_8_ = (double)local_2488._0_8_ * (double)local_2488._32_8_;
      auVar52 = vfmsub231sd_fma(auVar126,auVar161,auVar150);
      auVar151._8_8_ = 0;
      auVar151._0_8_ = (double)local_2488._40_8_ * (double)local_2488._8_8_;
      auVar52 = vfmadd213sd_avx512f(auVar151,auVar185,auVar52);
      auVar127._8_8_ = 0;
      auVar127._0_8_ = (double)local_2488._24_8_ * (double)local_2488._8_8_;
      auVar52 = vfnmadd213sd_fma(auVar127,auVar161,auVar52);
      auVar140._8_8_ = 0;
      auVar140._0_8_ = (double)local_2488._16_8_ * (double)local_2488._24_8_;
      auVar52 = vfmadd213sd_fma(auVar140,auVar181,auVar52);
      auVar52 = vfnmadd213sd_fma(auVar55,auVar179,auVar52);
      dVar58 = auVar52._0_8_;
      if (dVar58 < 0.0) {
        dVar141 = sqrt(dVar58);
      }
      else {
        auVar52 = vsqrtsd_avx(auVar52,auVar52);
        dVar141 = auVar52._0_8_;
      }
      Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::Identity();
      local_23a8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
      [0] = local_2558 * 0.3333333333333333;
      Eigen::MatrixBase<Eigen::Matrix<double,3,3,1,3,3>>::operator*
                ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                  *)local_1fb0,(MatrixBase<Eigen::Matrix<double,3,3,1,3,3>> *)&local_2250,
                 (double *)&local_23a8);
      local_15c0._8_8_ = local_1fb0._0_8_;
      local_15a8.m_value = local_1fb0._16_8_;
      local_2270.m_lhs = (LhsNested)pow(dVar58,-0.3333333333333333);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,1,3,3>>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,1,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>const>>
      ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                   *)local_1c80,
                  (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,1,3,3>>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,1,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>const>>
                   *)local_15c0,(double *)&local_2270);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,1,3,3>>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,1,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>>
                (&local_2088,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                  *)local_1c80);
      Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::Identity();
      Eigen::
      MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,1,3,3>>>
      ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                   *)&local_23a8,
                  (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,1,3,3>>>
                   *)&local_24d0,&local_2558);
      dVar172 = local_23a8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                m_data.array[2];
      local_2560 = 0.6666666666666666;
      Eigen::MatrixBase<Eigen::Matrix<double,3,3,1,3,3>>::operator*
                (&local_2270,(MatrixBase<Eigen::Matrix<double,3,3,1,3,3>> *)&local_2250,&local_2560)
      ;
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,1,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>>
      ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                   *)local_1fb0,
                  (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,1,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>>
                   *)&local_2270,&local_2528);
      local_1590 = (non_const_type)local_2488;
      local_15a0.m_value = (long)dVar172;
      local_1578 = (LhsNested)local_1fb0._8_8_;
      local_1568 = (double)local_1fb0._24_8_;
      local_1550 = (double)local_1fb0._48_8_;
      local_24c8 = pow(dVar58,-0.6666666666666666);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,1,3,3>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>const,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,1,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>const>>
      ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                   *)local_1c80,
                  (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,1,3,3>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>const,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,1,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>const>>
                   *)local_15c0,&local_24c8);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,1,3,3>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>const,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,1,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>>
                ((Matrix<double,_3,_3,_1,_3,_3> *)local_1d10,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                  *)local_1c80);
      local_15c0._0_8_ = dVar141 * 0.5;
      Eigen::MatrixBase<Eigen::Matrix<double,3,3,1,3,3>>::operator*
                ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                  *)local_1c80,(MatrixBase<Eigen::Matrix<double,3,3,1,3,3>> *)&local_2250,
                 (double *)local_15c0);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,1,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>>
                (&local_1d58,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                  *)local_1c80);
      local_2560 = this->element->CCOM1;
      local_2560 = local_2560 + local_2560;
      Eigen::MatrixBase<Eigen::Matrix<double,3,3,1,3,3>>::operator*
                ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                  *)local_1fb0,(MatrixBase<Eigen::Matrix<double,3,3,1,3,3>> *)&local_2088,
                 &local_2560);
      local_24c8 = this->element->CCOM2;
      local_24c8 = local_24c8 + local_24c8;
      Eigen::MatrixBase<Eigen::Matrix<double,3,3,1,3,3>>::operator*
                ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                  *)&local_23a8,(MatrixBase<Eigen::Matrix<double,3,3,1,3,3>> *)local_1d10,
                 &local_24c8);
      local_15c0._8_8_ = local_1fb0._0_8_;
      local_15a8.m_value = local_1fb0._16_8_;
      local_1598 = (ChMatrixNM<double,_6,_24> *)
                   local_23a8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage
                   .m_data.array[0];
      local_1588 = local_23a8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage
                   .m_data.array[2];
      local_24d0 = (dVar141 + -1.0) * dVar59;
      local_24d0 = local_24d0 + local_24d0;
      Eigen::MatrixBase<Eigen::Matrix<double,3,3,1,3,3>>::operator*
                (&local_2270,(MatrixBase<Eigen::Matrix<double,3,3,1,3,3>> *)&local_1d58,&local_24d0)
      ;
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,1,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,1,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>const>>
      ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>
                   *)local_1c80,
                  (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,1,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,1,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>const>>
                   *)local_15c0,
                  (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>
                   *)&local_2270);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,1,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,1,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,1,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>const>>
                (&local_2300,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>
                  *)local_1c80);
      dVar172 = local_2300.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                m_data.array[8];
      dVar175 = local_2300.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                m_data.array[5];
      dVar141 = local_2300.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                m_data.array[4];
      dVar173 = local_2300.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                m_data.array[2];
      dVar58 = local_2300.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[0];
      local_2550._0_8_ =
           local_2300.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
           array[1];
      pSVar40 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)&local_23e0,
                           lVar42);
      *pSVar40 = dVar162;
      dVar58 = dVar58 - local_2440;
      pSVar41 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_1> *)this_00,
                           lVar42,0);
      *pSVar41 = dVar58 / 1e-06;
      dVar141 = dVar141 - local_2438;
      pSVar41 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_1> *)this_00,
                           lVar42,1);
      *pSVar41 = dVar141 / 1e-06;
      dVar162 = (double)local_2550._0_8_ - local_2430;
      pSVar41 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_1> *)this_00,
                           lVar42,2);
      *pSVar41 = dVar162 / 1e-06;
      dVar172 = dVar172 - local_2428;
      pSVar41 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_1> *)this_00,
                           lVar42,3);
      *pSVar41 = dVar172 / 1e-06;
      dVar173 = dVar173 - local_2420;
      pSVar41 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_1> *)this_00,
                           lVar42,4);
      *pSVar41 = dVar173 / 1e-06;
      dVar175 = dVar175 - local_2418;
      pSVar41 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_1> *)this_00,
                           lVar42,5);
      *pSVar41 = dVar175 / 1e-06;
    }
    local_1c80._0_8_ = dst;
    local_1c80._8_8_ = this_00;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,9,6,1,9,6>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,9,1,6,9>>,Eigen::Matrix<double,6,6,1,6,6>,0>>
              ((Matrix<double,_9,_6,_1,_9,_6> *)local_1fb0,
               (Product<Eigen::Transpose<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>,_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0>
                *)local_1c80);
    local_1c80._0_8_ = this_01;
    local_1c80._8_8_ = (MatrixBase<Eigen::Matrix<double,6,1,0,6,1>> *)&local_2440;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,24,1,0,24,1>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,24,1,6,24>>,Eigen::Matrix<double,6,1,0,6,1>,0>>
              (&this->Fint,
               (Product<Eigen::Transpose<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>
                *)local_1c80);
    pCVar43 = this->element;
    auVar128._0_8_ = (pCVar43->m_InertFlexVec).m_data[1] * 0.5;
    auVar128._8_8_ = (pCVar43->m_InertFlexVec).m_data[2] * 0.5;
    auVar52 = vshufpd_avx(auVar128,auVar128,1);
    local_1c80._0_8_ =
         (pCVar43->m_InertFlexVec).m_data[0] * 0.5 * this->detJ0 * auVar128._0_8_ * auVar52._0_8_;
    Eigen::DenseBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>::operator*=
              ((DenseBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_> *)&this->Fint,
               (Scalar *)local_1c80);
    local_1c80._0_8_ = dst;
    local_1c80._8_8_ = (MatrixBase<Eigen::Matrix<double,6,1,0,6,1>> *)&local_2440;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,9,1,0,9,1>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,9,1,6,9>>,Eigen::Matrix<double,6,1,0,6,1>,0>>
              (&local_23a8,
               (Product<Eigen::Transpose<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>
                *)local_1c80);
  }
  pCVar43 = this->element;
  auVar129._0_8_ = (pCVar43->m_InertFlexVec).m_data[1] * 0.5;
  auVar129._8_8_ = (pCVar43->m_InertFlexVec).m_data[2] * 0.5;
  auVar52 = vshufpd_avx(auVar129,auVar129,1);
  local_1c80._0_8_ =
       (pCVar43->m_InertFlexVec).m_data[0] * 0.5 * this->detJ0 * auVar129._0_8_ * auVar52._0_8_;
  Eigen::DenseBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)&local_23a8,(Scalar *)local_1c80);
  pCVar43 = this->element;
  auVar130._0_8_ = (pCVar43->m_InertFlexVec).m_data[1] * 0.5;
  auVar130._8_8_ = (pCVar43->m_InertFlexVec).m_data[2] * 0.5;
  auVar52 = vshufpd_avx(auVar130,auVar130,1);
  local_2040[0] =
       (pCVar43->m_InertFlexVec).m_data[0] * 0.5 * this->detJ0 * auVar130._0_8_ * auVar52._0_8_;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_6,_1,_9,_6>_>,_const_Eigen::Matrix<double,_9,_6,_1,_9,_6>_>
                    *)local_15c0,local_2040,(StorageBaseType *)local_1fb0);
  local_1c70.m_other = local_15b0.m_other;
  local_1c68.m_other = (double)local_15a8.m_value;
  local_1c58.m_other = (double)dst;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,9,9,1,9,9>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,9,6,1,9,6>const>const,Eigen::Matrix<double,9,6,1,9,6>const>,Eigen::Matrix<double,6,9,1,6,9>,0>>
            ((Matrix<double,_9,_9,_1,_9,_9> *)local_708,
             (Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_6,_1,_9,_6>_>,_const_Eigen::Matrix<double,_9,_6,_1,_9,_6>_>,_Eigen::Matrix<double,_6,_9,_1,_6,_9>,_0>
              *)local_1c80);
  pCVar43 = this->element;
  auVar131._0_8_ = (pCVar43->m_InertFlexVec).m_data[1] * 0.5;
  auVar131._8_8_ = (pCVar43->m_InertFlexVec).m_data[2] * 0.5;
  auVar52 = vshufpd_avx(auVar131,auVar131,1);
  local_2208.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]
       = (pCVar43->m_InertFlexVec).m_data[0] * 0.5 * this->detJ0 * auVar131._0_8_ * auVar52._0_8_;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_6,_1,_9,_6>_>,_const_Eigen::Matrix<double,_9,_6,_1,_9,_6>_>
                    *)&local_e48,(double *)&local_2208,(StorageBaseType *)local_1fb0);
  local_15b0.m_other =
       local_e48.super_PlainObjectBase<Eigen::Matrix<double,_81,_1,_0,_81,_1>_>.m_storage.m_data.
       array[2];
  local_15a8.m_value =
       (long)local_e48.super_PlainObjectBase<Eigen::Matrix<double,_81,_1,_0,_81,_1>_>.m_storage.
             m_data.array[3];
  local_1598 = this_01;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,9,24,1,9,24>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,9,6,1,9,6>const>const,Eigen::Matrix<double,9,6,1,9,6>const>,Eigen::Matrix<double,6,24,1,6,24>,0>>
            ((Matrix<double,_9,_24,_1,_9,_24> *)local_1c80,
             (Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_6,_1,_9,_6>_>,_const_Eigen::Matrix<double,_9,_6,_1,_9,_6>_>,_Eigen::Matrix<double,_6,_24,_1,_6,_24>,_0>
              *)local_15c0);
  local_e48.super_PlainObjectBase<Eigen::Matrix<double,_81,_1,_0,_81,_1>_>.m_storage.m_data.array[0]
       = (double)local_1c80;
  Eigen::PlainObjectBase<Eigen::Matrix<double,216,1,0,216,1>>::
  PlainObjectBase<Eigen::Map<Eigen::Matrix<double,216,1,0,216,1>,0,Eigen::Stride<0,0>>>
            ((PlainObjectBase<Eigen::Matrix<double,216,1,0,216,1>> *)local_15c0,
             (DenseBase<Eigen::Map<Eigen::Matrix<double,_216,_1,_0,_216,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)&local_e48);
  local_22b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]
       = (double)local_708;
  Eigen::PlainObjectBase<Eigen::Matrix<double,81,1,0,81,1>>::
  PlainObjectBase<Eigen::Map<Eigen::Matrix<double,81,1,0,81,1>,0,Eigen::Stride<0,0>>>
            ((PlainObjectBase<Eigen::Matrix<double,81,1,0,81,1>> *)&local_e48,
             (DenseBase<Eigen::Map<Eigen::Matrix<double,_81,_1,_0,_81,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)&local_22b8);
  vector = local_23e8;
  Eigen::VectorBlock<Eigen::Matrix<double,_330,_1,_0,_330,_1>,_-1>::VectorBlock
            ((VectorBlock<Eigen::Matrix<double,_330,_1,_0,_330,_1>,__1> *)&local_22b8,local_23e8,0,
             0x18);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,330,1,0,330,1>,_1,1,false>,Eigen::Matrix<double,24,1,0,24,1>>
            ((Block<Eigen::Matrix<double,_330,_1,_0,_330,_1>,__1,_1,_false> *)&local_22b8,
             &this->Fint);
  Eigen::VectorBlock<Eigen::Matrix<double,_330,_1,_0,_330,_1>,_-1>::VectorBlock
            ((VectorBlock<Eigen::Matrix<double,_330,_1,_0,_330,_1>,__1> *)&local_22b8,vector,0x18,9)
  ;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,330,1,0,330,1>,_1,1,false>,Eigen::Matrix<double,9,1,0,9,1>>
            ((Block<Eigen::Matrix<double,_330,_1,_0,_330,_1>,__1,_1,_false> *)&local_22b8,
             &local_23a8);
  Eigen::VectorBlock<Eigen::Matrix<double,_330,_1,_0,_330,_1>,_-1>::VectorBlock
            ((VectorBlock<Eigen::Matrix<double,_330,_1,_0,_330,_1>,__1> *)&local_22b8,vector,0x21,
             0xd8);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,330,1,0,330,1>,_1,1,false>,Eigen::Matrix<double,216,1,0,216,1>>
            ((Block<Eigen::Matrix<double,_330,_1,_0,_330,_1>,__1,_1,_false> *)&local_22b8,
             (Matrix<double,_216,_1,_0,_216,_1> *)local_15c0);
  Eigen::VectorBlock<Eigen::Matrix<double,_330,_1,_0,_330,_1>,_-1>::VectorBlock
            ((VectorBlock<Eigen::Matrix<double,_330,_1,_0,_330,_1>,__1> *)&local_22b8,vector,0xf9,
             0x51);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,330,1,0,330,1>,_1,1,false>,Eigen::Matrix<double,81,1,0,81,1>>
            ((Block<Eigen::Matrix<double,_330,_1,_0,_330,_1>,__1,_1,_false> *)&local_22b8,&local_e48
            );
  return;
}

Assistant:

void Brick_ForceNumerical::Evaluate(ChVectorN<double, 330>& result, const double x, const double y, const double z) {
    element->ShapeFunctionsDerivativeX(Nx, x, y, z);
    element->ShapeFunctionsDerivativeY(Ny, x, y, z);
    element->ShapeFunctionsDerivativeZ(Nz, x, y, z);
    element->Basis_M(M, x, y, z);  // EAS

    if (!element->m_isMooney) {  // m_isMooney == false means linear elastic material
        double DD = (*E) * (1.0 - (*v)) / ((1.0 + (*v)) * (1.0 - 2.0 * (*v)));
        E_eps.fillDiagonal(1.0);
        E_eps(0, 1) = (*v) / (1.0 - (*v));
        E_eps(0, 3) = (*v) / (1.0 - (*v));
        E_eps(1, 0) = (*v) / (1.0 - (*v));
        E_eps(1, 3) = (*v) / (1.0 - (*v));
        E_eps(2, 2) = (1.0 - 2.0 * (*v)) / (2.0 * (1.0 - (*v)));
        E_eps(3, 0) = (*v) / (1.0 - (*v));
        E_eps(3, 1) = (*v) / (1.0 - (*v));
        E_eps(4, 4) = (1.0 - 2.0 * (*v)) / (2.0 * (1.0 - (*v)));
        E_eps(5, 5) = (1.0 - 2.0 * (*v)) / (2.0 * (1.0 - (*v)));
        E_eps *= DD;
    }
    // Expand shape functions Sx, Sy, Sz
    // Sx=[Nx1*eye(3) Nx2*eye(3) Nx3*eye(3) Nx4*eye(3) Nx5*eye(3) Nx6*eye(3) Nx7*eye(3) Nx8*eye(3)]

    for (int i = 0; i < 8; i++) {
        Sx(0, 3 * i + 0) = Nx(i);
        Sx(1, 3 * i + 1) = Nx(i);
        Sx(2, 3 * i + 2) = Nx(i);
    }

    for (int i = 0; i < 8; i++) {
        Sy(0, 3 * i + 0) = Ny(i);
        Sy(1, 3 * i + 1) = Ny(i);
        Sy(2, 3 * i + 2) = Ny(i);
    }

    for (int i = 0; i < 8; i++) {
        Sz(0, 3 * i + 0) = Nz(i);
        Sz(1, 3 * i + 1) = Nz(i);
        Sz(2, 3 * i + 2) = Nz(i);
    }

    //==EAS and Initial Shape==//
    ChMatrixNM<double, 3, 3> rd0;
    rd0.col(0) = (*d0).transpose() * Nx.transpose();
    rd0.col(1) = (*d0).transpose() * Ny.transpose();
    rd0.col(2) = (*d0).transpose() * Nz.transpose();
    detJ0 = rd0.determinant();

    //////////////////////////////////////////////////////////////
    //// Transformation : Orthogonal transformation (A and J) ////
    //////////////////////////////////////////////////////////////
    ChVector<double> G1;
    ChVector<double> G2;
    ChVector<double> G3;
    ChVector<double> G1xG2;
    G1[0] = rd0(0, 0);
    G2[0] = rd0(0, 1);
    G3[0] = rd0(0, 2);
    G1[1] = rd0(1, 0);
    G2[1] = rd0(1, 1);
    G3[1] = rd0(1, 2);
    G1[2] = rd0(2, 0);
    G2[2] = rd0(2, 1);
    G3[2] = rd0(2, 2);
    G1xG2.Cross(G1, G2);

    ////Tangent Frame
    ChVector<> A1 = G1 / sqrt(G1[0] * G1[0] + G1[1] * G1[1] + G1[2] * G1[2]);
    ChVector<> A3 = G1xG2 / sqrt(G1xG2[0] * G1xG2[0] + G1xG2[1] * G1xG2[1] + G1xG2[2] * G1xG2[2]);
    ChVector<> A2 = A3.Cross(A1);

    ////Direction for orthotropic material//
    double theta = 0.0;
    ChVector<> AA1 = A1 * cos(theta) + A2 * sin(theta);
    ChVector<> AA2 = -A1 * sin(theta) + A2 * cos(theta);
    ChVector<> AA3 = A3;

    ////Beta
    ChMatrixNM<double, 3, 3> j0 = rd0.inverse();
    ChVector<double> j01;
    ChVector<double> j02;
    ChVector<double> j03;
    j01[0] = j0(0, 0);
    j02[0] = j0(1, 0);
    j03[0] = j0(2, 0);
    j01[1] = j0(0, 1);
    j02[1] = j0(1, 1);
    j03[1] = j0(2, 1);
    j01[2] = j0(0, 2);
    j02[2] = j0(1, 2);
    j03[2] = j0(2, 2);
    ChVectorN<double, 9> beta;
    beta(0) = Vdot(AA1, j01);
    beta(1) = Vdot(AA2, j01);
    beta(2) = Vdot(AA3, j01);
    beta(3) = Vdot(AA1, j02);
    beta(4) = Vdot(AA2, j02);
    beta(5) = Vdot(AA3, j02);
    beta(6) = Vdot(AA1, j03);
    beta(7) = Vdot(AA2, j03);
    beta(8) = Vdot(AA3, j03);

    //////////////////////////////////////////////////
    //// Enhanced Assumed Strain /////////////////////
    //////////////////////////////////////////////////
    G = (*T0) * M * ((*detJ0C) / detJ0);
    strain_EAS = G * (*alpha_eas);

    ChMatrixNM<double, 8, 8> d_d = (*d) * (*d).transpose();
    ChVectorN<double, 8> ddNx = d_d * Nx.transpose();
    ChVectorN<double, 8> ddNy = d_d * Ny.transpose();
    ChVectorN<double, 8> ddNz = d_d * Nz.transpose();

    ChMatrixNM<double, 8, 8> d0_d0 = (*d0) * (*d0).transpose();
    ChVectorN<double, 8> d0d0Nx = d0_d0 * Nx.transpose();
    ChVectorN<double, 8> d0d0Ny = d0_d0 * Ny.transpose();
    ChVectorN<double, 8> d0d0Nz = d0_d0 * Nz.transpose();

    ///////////////////////////
    /// Strain component //////
    ///////////////////////////
    ChVectorN<double, 6> strain_til;
    strain_til(0) = 0.5 * Nx.dot(ddNx - d0d0Nx);
    strain_til(1) = 0.5 * Ny.dot(ddNy - d0d0Ny);
    strain_til(2) = Nx.dot(ddNy - d0d0Ny);
    //== Compatible strain (No ANS) ==//
    strain_til(3) = 0.5 * Nz.dot(ddNz - d0d0Nz);
    strain_til(4) = Nx.dot(ddNz - d0d0Nz);
    strain_til(5) = Ny.dot(ddNz - d0d0Nz);

    //// For orthotropic material ///
    strain(0) = strain_til(0) * beta(0) * beta(0) + strain_til(1) * beta(3) * beta(3) +
                strain_til(2) * beta(0) * beta(3) + strain_til(3) * beta(6) * beta(6) +
                strain_til(4) * beta(0) * beta(6) + strain_til(5) * beta(3) * beta(6);
    strain(1) = strain_til(0) * beta(1) * beta(1) + strain_til(1) * beta(4) * beta(4) +
                strain_til(2) * beta(1) * beta(4) + strain_til(3) * beta(7) * beta(7) +
                strain_til(4) * beta(1) * beta(7) + strain_til(5) * beta(4) * beta(7);
    strain(2) = strain_til(0) * 2.0 * beta(0) * beta(1) + strain_til(1) * 2.0 * beta(3) * beta(4) +
                strain_til(2) * (beta(1) * beta(3) + beta(0) * beta(4)) + strain_til(3) * 2.0 * beta(6) * beta(7) +
                strain_til(4) * (beta(1) * beta(6) + beta(0) * beta(7)) +
                strain_til(5) * (beta(4) * beta(6) + beta(3) * beta(7));
    strain(3) = strain_til(0) * beta(2) * beta(2) + strain_til(1) * beta(5) * beta(5) +
                strain_til(2) * beta(2) * beta(5) + strain_til(3) * beta(8) * beta(8) +
                strain_til(4) * beta(2) * beta(8) + strain_til(5) * beta(5) * beta(8);
    strain(4) = strain_til(0) * 2.0 * beta(0) * beta(2) + strain_til(1) * 2.0 * beta(3) * beta(5) +
                strain_til(2) * (beta(2) * beta(3) + beta(0) * beta(5)) + strain_til(3) * 2.0 * beta(6) * beta(8) +
                strain_til(4) * (beta(2) * beta(6) + beta(0) * beta(8)) +
                strain_til(5) * (beta(5) * beta(6) + beta(3) * beta(8));
    strain(5) = strain_til(0) * 2.0 * beta(1) * beta(2) + strain_til(1) * 2.0 * beta(4) * beta(5) +
                strain_til(2) * (beta(2) * beta(4) + beta(1) * beta(5)) + strain_til(3) * 2.0 * beta(7) * beta(8) +
                strain_til(4) * (beta(2) * beta(7) + beta(1) * beta(8)) +
                strain_til(5) * (beta(5) * beta(7) + beta(4) * beta(8));

    ////////////////////////////////////
    /// Straint derivative component ///
    ////////////////////////////////////
    ChMatrixNM<double, 6, 24> strainD_til;
    strainD_til.row(0) = Nx * (*d) * Sx;
    strainD_til.row(1) = Ny * (*d) * Sy;
    strainD_til.row(2) = Nx * (*d) * Sy + Ny * (*d) * Sx;
    //== Compatible strain (No ANS)==//
    strainD_til.row(3) = Nz * (*d) * Sz;
    strainD_til.row(4) = Nx * (*d) * Sz + Nz * (*d) * Sx;
    strainD_til.row(5) = Ny * (*d) * Sz + Nz * (*d) * Sy;

    //// For orthotropic material ///
    for (int ii = 0; ii < 24; ii++) {
        strainD(0, ii) = strainD_til(0, ii) * beta(0) * beta(0) + strainD_til(1, ii) * beta(3) * beta(3) +
                         strainD_til(2, ii) * beta(0) * beta(3) + strainD_til(3, ii) * beta(6) * beta(6) +
                         strainD_til(4, ii) * beta(0) * beta(6) + strainD_til(5, ii) * beta(3) * beta(6);
        strainD(1, ii) = strainD_til(0, ii) * beta(1) * beta(1) + strainD_til(1, ii) * beta(4) * beta(4) +
                         strainD_til(2, ii) * beta(1) * beta(4) + strainD_til(3, ii) * beta(7) * beta(7) +
                         strainD_til(4, ii) * beta(1) * beta(7) + strainD_til(5, ii) * beta(4) * beta(7);
        strainD(2, ii) = strainD_til(0, ii) * 2.0 * beta(0) * beta(1) + strainD_til(1, ii) * 2.0 * beta(3) * beta(4) +
                         strainD_til(2, ii) * (beta(1) * beta(3) + beta(0) * beta(4)) +
                         strainD_til(3, ii) * 2.0 * beta(6) * beta(7) +
                         strainD_til(4, ii) * (beta(1) * beta(6) + beta(0) * beta(7)) +
                         strainD_til(5, ii) * (beta(4) * beta(6) + beta(3) * beta(7));
        strainD(3, ii) = strainD_til(0, ii) * beta(2) * beta(2) + strainD_til(1, ii) * beta(5) * beta(5) +
                         strainD_til(2, ii) * beta(2) * beta(5) + strainD_til(3, ii) * beta(8) * beta(8) +
                         strainD_til(4, ii) * beta(2) * beta(8) + strainD_til(5) * beta(5) * beta(8);
        strainD(4, ii) = strainD_til(0, ii) * 2.0 * beta(0) * beta(2) + strainD_til(1, ii) * 2.0 * beta(3) * beta(5) +
                         strainD_til(2, ii) * (beta(2) * beta(3) + beta(0) * beta(5)) +
                         strainD_til(3, ii) * 2.0 * beta(6) * beta(8) +
                         strainD_til(4, ii) * (beta(2) * beta(6) + beta(0) * beta(8)) +
                         strainD_til(5, ii) * (beta(5) * beta(6) + beta(3) * beta(8));
        strainD(5, ii) = strainD_til(0, ii) * 2.0 * beta(1) * beta(2) + strainD_til(1, ii) * 2.0 * beta(4) * beta(5) +
                         strainD_til(2, ii) * (beta(2) * beta(4) + beta(1) * beta(5)) +
                         strainD_til(3, ii) * 2.0 * beta(7) * beta(8) +
                         strainD_til(4, ii) * (beta(2) * beta(7) + beta(1) * beta(8)) +
                         strainD_til(5, ii) * (beta(5) * beta(7) + beta(4) * beta(8));
    }

    ///////////////////////////////////
    /// Enhanced Assumed Strain 2nd ///
    ///////////////////////////////////
    strain += strain_EAS;  // same as EPS in FORTRAN

    ChMatrixNM<double, 9, 6> temp56;  // same as TEMP1 in FORTRAN
    ChVectorN<double, 9> HE1;
    ChMatrixNM<double, 9, 24> GDEPSP;
    ChMatrixNM<double, 9, 9> KALPHA;

    // m_isMooney == 1 use Iso_Nonlinear_Mooney-Rivlin Material (2-parameters=> 3 inputs)
    if (element->m_isMooney == 1) {
        ChMatrix33<> CG;  // CG: Right Cauchy-Green tensor  C=trans(F)*F
        ChMatrix33<> INVCG;
        ChMatrix33<> I1PC;
        ChMatrix33<> I2PC;
        ChMatrix33<> JPC;
        ChMatrix33<> STR;

        ChMatrix33<> CGN;
        ChMatrix33<> INVCGN;
        ChMatrix33<> I1PCN;
        ChMatrix33<> I2PCN;
        ChMatrix33<> JPCN;
        ChMatrix33<> STRN;

        ChVectorN<double, 6> strain_1;

        CG(0, 0) = 2.0 * strain(0) + 1.0;
        CG(1, 1) = 2.0 * strain(1) + 1.0;
        CG(2, 2) = 2.0 * strain(3) + 1.0;
        CG(1, 0) = strain(2);
        CG(0, 1) = CG(1, 0);
        CG(2, 0) = strain(4);
        CG(0, 2) = CG(2, 0);
        CG(2, 1) = strain(5);
        CG(1, 2) = CG(2, 1);

        INVCG = CG.inverse();

        double Deld = 0.000001;
        double I1 = CG(0, 0) + CG(1, 1) + CG(2, 2);
        double I2 = 0.5 * (pow(I1, 2) - (pow(CG(0, 0), 2) + pow(CG(1, 0), 2) + pow(CG(2, 0), 2) + pow(CG(0, 1), 2) +
                                         pow(CG(1, 1), 2) + pow(CG(2, 1), 2) + pow(CG(0, 2), 2) + pow(CG(1, 2), 2) +
                                         pow(CG(2, 2), 2)));
        double I3 = CG(0, 0) * CG(1, 1) * CG(2, 2) - CG(0, 0) * CG(1, 2) * CG(2, 1) + CG(0, 1) * CG(1, 2) * CG(2, 0) -
                    CG(0, 1) * CG(1, 0) * CG(2, 2) + CG(0, 2) * CG(1, 0) * CG(2, 1) - CG(2, 0) * CG(1, 1) * CG(0, 2);
        double J = sqrt(I3);
        // double CCOM1 = 551584.0;                                    // C10   not 0.551584
        // double CCOM2 = 137896.0;                                    // C01   not 0.137896
        double CCOM3 = 2.0 * (element->CCOM1 + element->CCOM2) / (1.0 - 2.0 * 0.49);  // K:bulk modulus
        double StockEPS;

        I1PC = (ChMatrix33<>::Identity() - INVCG * (1.0 / 3.0 * I1)) * pow(I3, -1.0 / 3.0);
        I2PC = (((ChMatrix33<>::Identity() * I1) - CG) - (INVCG * (2.0 / 3.0) * I2)) * pow(I3, -2.0 / 3.0);
        JPC = INVCG * (J / 2.0);

        STR = I1PC * (element->CCOM1 * 2.0) + I2PC * (element->CCOM2 * 2.0) + JPC * (CCOM3 * (J - 1.0) * 2.0);

        ChVectorN<double, 6> TEMP5;
        TEMP5(0) = STR(0, 0);
        TEMP5(1) = STR(1, 1);
        TEMP5(2) = STR(0, 1);
        TEMP5(3) = STR(2, 2);
        TEMP5(4) = STR(0, 2);
        TEMP5(5) = STR(1, 2);

        E_eps.setZero();

        ChVectorN<double, 6> TEMP5N;
        strain_1 = strain;
        for (int JJJ = 0; JJJ < 6; JJJ++) {
            StockEPS = strain_1(JJJ);
            strain_1(JJJ) = StockEPS + Deld;
            CGN(0, 0) = 2.0 * strain_1(0) + 1.0;
            CGN(1, 1) = 2.0 * strain_1(1) + 1.0;
            CGN(2, 2) = 2.0 * strain_1(3) + 1.0;
            CGN(1, 0) = strain_1(2);
            CGN(0, 1) = CGN(1, 0);
            CGN(2, 0) = strain_1(4);
            CGN(0, 2) = CGN(2, 0);
            CGN(2, 1) = strain_1(5);
            CGN(1, 2) = CGN(2, 1);
            INVCGN = CGN.inverse();
            I1 = CGN(0, 0) + CGN(1, 1) + CGN(2, 2);
            I2 = 0.5 * (pow(I1, 2) - (pow(CGN(0, 0), 2) + pow(CGN(1, 0), 2) + pow(CGN(2, 0), 2) + pow(CGN(0, 1), 2) +
                                      pow(CGN(1, 1), 2) + pow(CGN(2, 1), 2) + pow(CGN(0, 2), 2) + pow(CGN(1, 2), 2) +
                                      pow(CGN(2, 2), 2)));
            I3 = CGN(0, 0) * CGN(1, 1) * CGN(2, 2) - CGN(0, 0) * CGN(1, 2) * CGN(2, 1) +
                 CGN(0, 1) * CGN(1, 2) * CGN(2, 0) - CGN(0, 1) * CGN(1, 0) * CGN(2, 2) +
                 CGN(0, 2) * CGN(1, 0) * CGN(2, 1) - CGN(2, 0) * CGN(1, 1) * CGN(0, 2);
            J = sqrt(I3);
            I1PCN = (ChMatrix33<>::Identity() - INVCGN * (1.0 / 3.0 * I1)) * pow(I3, -1.0 / 3.0);
            I2PCN = (((ChMatrix33<>::Identity() * I1) - CGN) - (INVCGN * (2.0 / 3.0) * I2)) * pow(I3, -2.0 / 3.0);
            JPCN = INVCGN * (J / 2.0);
            STRN = I1PCN * (element->CCOM1 * 2.0) + I2PCN * (element->CCOM2 * 2.0) + JPCN * (CCOM3 * (J - 1.0) * 2.0);
            TEMP5N(0) = STRN(0, 0);
            TEMP5N(1) = STRN(1, 1);
            TEMP5N(2) = STRN(0, 1);
            TEMP5N(3) = STRN(2, 2);
            TEMP5N(4) = STRN(0, 2);
            TEMP5N(5) = STRN(1, 2);
            strain_1(JJJ) = StockEPS;
            E_eps(JJJ, 0) = (TEMP5N(0) - TEMP5(0)) / Deld;
            E_eps(JJJ, 1) = (TEMP5N(1) - TEMP5(1)) / Deld;
            E_eps(JJJ, 2) = (TEMP5N(2) - TEMP5(2)) / Deld;
            E_eps(JJJ, 3) = (TEMP5N(3) - TEMP5(3)) / Deld;
            E_eps(JJJ, 4) = (TEMP5N(4) - TEMP5(4)) / Deld;
            E_eps(JJJ, 5) = (TEMP5N(5) - TEMP5(5)) / Deld;
        }
        temp56 = G.transpose() * E_eps;
        Fint = strainD.transpose() * TEMP5;
        Fint *= detJ0 * (element->GetLengthX() / 2.0) * (element->GetLengthY() / 2.0) * (element->GetLengthZ() / 2.0);
        HE1 = G.transpose() * TEMP5;
        HE1 *= detJ0 * (element->GetLengthX() / 2.0) * (element->GetLengthY() / 2.0) * (element->GetLengthZ() / 2.0);
    } else {
        temp56 = G.transpose() * E_eps;
        Fint = strainD.transpose() * E_eps * strain;
        Fint *= detJ0 * (element->GetLengthX() / 2.0) * (element->GetLengthY() / 2.0) * (element->GetLengthZ() / 2.0);
        HE1 = temp56 * strain;
        HE1 *= detJ0 * (element->GetLengthX() / 2.0) * (element->GetLengthY() / 2.0) * (element->GetLengthZ() / 2.0);
    }  // end of   if(*flag_Mooney==1)

    double factor_k =
        detJ0 * (element->GetLengthX() / 2.0) * (element->GetLengthY() / 2.0) * (element->GetLengthZ() / 2.0);
    KALPHA = factor_k * temp56 * G;
    double factor_g =
        detJ0 * (element->GetLengthX() / 2.0) * (element->GetLengthY() / 2.0) * (element->GetLengthZ() / 2.0);
    GDEPSP = factor_g * temp56 * strainD;

    ChVectorN<double, 216> GDEPSPVec = Eigen::Map<ChVectorN<double, 216>>(GDEPSP.data(), 216);
    ChVectorN<double, 81> KALPHAVec = Eigen::Map<ChVectorN<double, 81>>(KALPHA.data(), 81);

    result.segment(0, 24) = Fint;
    result.segment(24, 9) = HE1;
    result.segment(33, 216) = GDEPSPVec;
    result.segment(249, 81) = KALPHAVec;
}